

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  Primitive PVar5;
  uint uVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined8 uVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  byte bVar28;
  uint uVar29;
  ulong uVar30;
  uint uVar32;
  long lVar33;
  uint uVar34;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  ulong uVar35;
  LinearSpace3fa *pLVar36;
  uint uVar37;
  bool bVar38;
  bool bVar39;
  ulong uVar40;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar54 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  int iVar102;
  float fVar103;
  undefined4 uVar104;
  vfloat4 a0_2;
  undefined1 auVar105 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  vfloat4 b0;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar126;
  vfloat4 a0_3;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  __m128 a_1;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar168;
  float fVar169;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar188;
  float fVar201;
  float fVar202;
  __m128 a;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar203;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar204;
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar215;
  float fVar224;
  float fVar225;
  vfloat4 a0_1;
  undefined1 auVar216 [16];
  float fVar226;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  vfloat4 a0;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  int iVar245;
  undefined1 in_ZMM31 [64];
  undefined1 auVar246 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_499;
  undefined8 local_388;
  undefined8 uStack_380;
  RayK<4> *local_378;
  LinearSpace3fa *local_370;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  uint auStack_318 [4];
  RTCFilterFunctionNArguments local_308;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  uint uStack_168;
  float afStack_164 [7];
  RTCHitN local_148 [16];
  undefined1 local_138 [16];
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  uint local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar31;
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  
  PVar5 = prim[1];
  uVar30 = (ulong)(byte)PVar5;
  fVar1 = *(float *)(prim + uVar30 * 0x19 + 0x12);
  auVar41 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar41 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar50 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar42 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar44 = vsubps_avx(auVar41,*(undefined1 (*) [16])(prim + uVar30 * 0x19 + 6));
  fVar126 = fVar1 * auVar44._0_4_;
  fVar103 = fVar1 * auVar42._0_4_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar30 * 4 + 6);
  auVar75 = vpmovsxbd_avx2(auVar41);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar30 * 5 + 6);
  auVar73 = vpmovsxbd_avx2(auVar50);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar30 * 6 + 6);
  auVar74 = vpmovsxbd_avx2(auVar4);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar30 * 0xb + 6);
  auVar86 = vpmovsxbd_avx2(auVar51);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  auVar76 = vpmovsxbd_avx2(auVar52);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + (uint)(byte)PVar5 * 0xc + uVar30 + 6);
  auVar77 = vpmovsxbd_avx2(auVar47);
  auVar77 = vcvtdq2ps_avx(auVar77);
  uVar35 = (ulong)(uint)((int)(uVar30 * 9) * 2);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar35 + 6);
  auVar78 = vpmovsxbd_avx2(auVar53);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar35 + uVar30 + 6);
  auVar81 = vpmovsxbd_avx2(auVar55);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar79 = vcvtdq2ps_avx(auVar81);
  uVar40 = (ulong)(uint)((int)(uVar30 * 5) << 2);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar40 + 6);
  auVar71 = vpmovsxbd_avx2(auVar43);
  auVar80 = vcvtdq2ps_avx(auVar71);
  auVar135._4_4_ = fVar103;
  auVar135._0_4_ = fVar103;
  auVar135._8_4_ = fVar103;
  auVar135._12_4_ = fVar103;
  auVar135._16_4_ = fVar103;
  auVar135._20_4_ = fVar103;
  auVar135._24_4_ = fVar103;
  auVar135._28_4_ = fVar103;
  auVar236._8_4_ = 1;
  auVar236._0_8_ = 0x100000001;
  auVar236._12_4_ = 1;
  auVar236._16_4_ = 1;
  auVar236._20_4_ = 1;
  auVar236._24_4_ = 1;
  auVar236._28_4_ = 1;
  auVar82 = ZEXT1632(CONCAT412(fVar1 * auVar42._12_4_,
                               CONCAT48(fVar1 * auVar42._8_4_,
                                        CONCAT44(fVar1 * auVar42._4_4_,fVar103))));
  auVar72 = vpermps_avx2(auVar236,auVar82);
  auVar69 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar244 = ZEXT3264(auVar69);
  auVar70 = vpermps_avx512vl(auVar69,auVar82);
  fVar103 = auVar70._0_4_;
  fVar188 = auVar70._4_4_;
  auVar82._4_4_ = fVar188 * auVar74._4_4_;
  auVar82._0_4_ = fVar103 * auVar74._0_4_;
  fVar201 = auVar70._8_4_;
  auVar82._8_4_ = fVar201 * auVar74._8_4_;
  fVar202 = auVar70._12_4_;
  auVar82._12_4_ = fVar202 * auVar74._12_4_;
  fVar106 = auVar70._16_4_;
  auVar82._16_4_ = fVar106 * auVar74._16_4_;
  fVar107 = auVar70._20_4_;
  auVar82._20_4_ = fVar107 * auVar74._20_4_;
  fVar108 = auVar70._24_4_;
  auVar82._24_4_ = fVar108 * auVar74._24_4_;
  auVar82._28_4_ = auVar81._28_4_;
  auVar81._4_4_ = auVar77._4_4_ * fVar188;
  auVar81._0_4_ = auVar77._0_4_ * fVar103;
  auVar81._8_4_ = auVar77._8_4_ * fVar201;
  auVar81._12_4_ = auVar77._12_4_ * fVar202;
  auVar81._16_4_ = auVar77._16_4_ * fVar106;
  auVar81._20_4_ = auVar77._20_4_ * fVar107;
  auVar81._24_4_ = auVar77._24_4_ * fVar108;
  auVar81._28_4_ = auVar71._28_4_;
  auVar71._4_4_ = auVar80._4_4_ * fVar188;
  auVar71._0_4_ = auVar80._0_4_ * fVar103;
  auVar71._8_4_ = auVar80._8_4_ * fVar201;
  auVar71._12_4_ = auVar80._12_4_ * fVar202;
  auVar71._16_4_ = auVar80._16_4_ * fVar106;
  auVar71._20_4_ = auVar80._20_4_ * fVar107;
  auVar71._24_4_ = auVar80._24_4_ * fVar108;
  auVar71._28_4_ = auVar70._28_4_;
  auVar41 = vfmadd231ps_fma(auVar82,auVar72,auVar73);
  auVar50 = vfmadd231ps_fma(auVar81,auVar72,auVar76);
  auVar4 = vfmadd231ps_fma(auVar71,auVar79,auVar72);
  auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar135,auVar75);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar135,auVar86);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar78,auVar135);
  auVar142._4_4_ = fVar126;
  auVar142._0_4_ = fVar126;
  auVar142._8_4_ = fVar126;
  auVar142._12_4_ = fVar126;
  auVar142._16_4_ = fVar126;
  auVar142._20_4_ = fVar126;
  auVar142._24_4_ = fVar126;
  auVar142._28_4_ = fVar126;
  auVar71 = ZEXT1632(CONCAT412(fVar1 * auVar44._12_4_,
                               CONCAT48(fVar1 * auVar44._8_4_,
                                        CONCAT44(fVar1 * auVar44._4_4_,fVar126))));
  auVar81 = vpermps_avx2(auVar236,auVar71);
  auVar71 = vpermps_avx512vl(auVar69,auVar71);
  auVar72 = vmulps_avx512vl(auVar71,auVar74);
  auVar84._0_4_ = auVar71._0_4_ * auVar77._0_4_;
  auVar84._4_4_ = auVar71._4_4_ * auVar77._4_4_;
  auVar84._8_4_ = auVar71._8_4_ * auVar77._8_4_;
  auVar84._12_4_ = auVar71._12_4_ * auVar77._12_4_;
  auVar84._16_4_ = auVar71._16_4_ * auVar77._16_4_;
  auVar84._20_4_ = auVar71._20_4_ * auVar77._20_4_;
  auVar84._24_4_ = auVar71._24_4_ * auVar77._24_4_;
  auVar84._28_4_ = 0;
  auVar77._4_4_ = auVar71._4_4_ * auVar80._4_4_;
  auVar77._0_4_ = auVar71._0_4_ * auVar80._0_4_;
  auVar77._8_4_ = auVar71._8_4_ * auVar80._8_4_;
  auVar77._12_4_ = auVar71._12_4_ * auVar80._12_4_;
  auVar77._16_4_ = auVar71._16_4_ * auVar80._16_4_;
  auVar77._20_4_ = auVar71._20_4_ * auVar80._20_4_;
  auVar77._24_4_ = auVar71._24_4_ * auVar80._24_4_;
  auVar77._28_4_ = auVar74._28_4_;
  auVar73 = vfmadd231ps_avx512vl(auVar72,auVar81,auVar73);
  auVar51 = vfmadd231ps_fma(auVar84,auVar81,auVar76);
  auVar52 = vfmadd231ps_fma(auVar77,auVar81,auVar79);
  auVar73 = vfmadd231ps_avx512vl(auVar73,auVar142,auVar75);
  auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar142,auVar86);
  auVar52 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar142,auVar78);
  auVar87._8_4_ = 0x7fffffff;
  auVar87._0_8_ = 0x7fffffff7fffffff;
  auVar87._12_4_ = 0x7fffffff;
  auVar87._16_4_ = 0x7fffffff;
  auVar87._20_4_ = 0x7fffffff;
  auVar87._24_4_ = 0x7fffffff;
  auVar87._28_4_ = 0x7fffffff;
  auVar75 = vandps_avx(ZEXT1632(auVar41),auVar87);
  auVar89._8_4_ = 0x219392ef;
  auVar89._0_8_ = 0x219392ef219392ef;
  auVar89._12_4_ = 0x219392ef;
  auVar89._16_4_ = 0x219392ef;
  auVar89._20_4_ = 0x219392ef;
  auVar89._24_4_ = 0x219392ef;
  auVar89._28_4_ = 0x219392ef;
  uVar35 = vcmpps_avx512vl(auVar75,auVar89,1);
  bVar38 = (bool)((byte)uVar35 & 1);
  auVar72._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar41._0_4_;
  bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar41._4_4_;
  bVar38 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar41._8_4_;
  bVar38 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar41._12_4_;
  auVar72._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar72._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar72._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar72._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar75 = vandps_avx(ZEXT1632(auVar50),auVar87);
  uVar35 = vcmpps_avx512vl(auVar75,auVar89,1);
  bVar38 = (bool)((byte)uVar35 & 1);
  auVar69._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar50._0_4_;
  bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar69._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar50._4_4_;
  bVar38 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar69._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar50._8_4_;
  bVar38 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar69._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar50._12_4_;
  auVar69._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar69._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar69._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar69._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar75 = vandps_avx(ZEXT1632(auVar4),auVar87);
  uVar35 = vcmpps_avx512vl(auVar75,auVar89,1);
  bVar38 = (bool)((byte)uVar35 & 1);
  auVar75._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar4._0_4_;
  bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar4._4_4_;
  bVar38 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar4._8_4_;
  bVar38 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar4._12_4_;
  auVar75._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar75._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar75._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar75._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar74 = vrcp14ps_avx512vl(auVar72);
  auVar88._8_4_ = 0x3f800000;
  auVar88._0_8_ = &DAT_3f8000003f800000;
  auVar88._12_4_ = 0x3f800000;
  auVar88._16_4_ = 0x3f800000;
  auVar88._20_4_ = 0x3f800000;
  auVar88._24_4_ = 0x3f800000;
  auVar88._28_4_ = 0x3f800000;
  auVar41 = vfnmadd213ps_fma(auVar72,auVar74,auVar88);
  auVar41 = vfmadd132ps_fma(ZEXT1632(auVar41),auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar69);
  auVar50 = vfnmadd213ps_fma(auVar69,auVar74,auVar88);
  auVar50 = vfmadd132ps_fma(ZEXT1632(auVar50),auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar75);
  auVar4 = vfnmadd213ps_fma(auVar75,auVar74,auVar88);
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar74,auVar74);
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 7 + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74 = vsubps_avx512vl(auVar75,auVar73);
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 9 + 6));
  auVar78._4_4_ = auVar41._4_4_ * auVar74._4_4_;
  auVar78._0_4_ = auVar41._0_4_ * auVar74._0_4_;
  auVar78._8_4_ = auVar41._8_4_ * auVar74._8_4_;
  auVar78._12_4_ = auVar41._12_4_ * auVar74._12_4_;
  auVar78._16_4_ = auVar74._16_4_ * 0.0;
  auVar78._20_4_ = auVar74._20_4_ * 0.0;
  auVar78._24_4_ = auVar74._24_4_ * 0.0;
  auVar78._28_4_ = auVar74._28_4_;
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx512vl(auVar75,auVar73);
  auVar85._0_4_ = auVar41._0_4_ * auVar75._0_4_;
  auVar85._4_4_ = auVar41._4_4_ * auVar75._4_4_;
  auVar85._8_4_ = auVar41._8_4_ * auVar75._8_4_;
  auVar85._12_4_ = auVar41._12_4_ * auVar75._12_4_;
  auVar85._16_4_ = auVar75._16_4_ * 0.0;
  auVar85._20_4_ = auVar75._20_4_ * 0.0;
  auVar85._24_4_ = auVar75._24_4_ * 0.0;
  auVar85._28_4_ = 0;
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar5 * 0x10 + 6));
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar5 * 0x10 + uVar30 * -2 + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,ZEXT1632(auVar51));
  auVar79._4_4_ = auVar50._4_4_ * auVar75._4_4_;
  auVar79._0_4_ = auVar50._0_4_ * auVar75._0_4_;
  auVar79._8_4_ = auVar50._8_4_ * auVar75._8_4_;
  auVar79._12_4_ = auVar50._12_4_ * auVar75._12_4_;
  auVar79._16_4_ = auVar75._16_4_ * 0.0;
  auVar79._20_4_ = auVar75._20_4_ * 0.0;
  auVar79._24_4_ = auVar75._24_4_ * 0.0;
  auVar79._28_4_ = auVar75._28_4_;
  auVar75 = vcvtdq2ps_avx(auVar73);
  auVar75 = vsubps_avx(auVar75,ZEXT1632(auVar51));
  auVar83._0_4_ = auVar50._0_4_ * auVar75._0_4_;
  auVar83._4_4_ = auVar50._4_4_ * auVar75._4_4_;
  auVar83._8_4_ = auVar50._8_4_ * auVar75._8_4_;
  auVar83._12_4_ = auVar50._12_4_ * auVar75._12_4_;
  auVar83._16_4_ = auVar75._16_4_ * 0.0;
  auVar83._20_4_ = auVar75._20_4_ * 0.0;
  auVar83._24_4_ = auVar75._24_4_ * 0.0;
  auVar83._28_4_ = 0;
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar40 + uVar30 + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,ZEXT1632(auVar52));
  auVar80._4_4_ = auVar75._4_4_ * auVar4._4_4_;
  auVar80._0_4_ = auVar75._0_4_ * auVar4._0_4_;
  auVar80._8_4_ = auVar75._8_4_ * auVar4._8_4_;
  auVar80._12_4_ = auVar75._12_4_ * auVar4._12_4_;
  auVar80._16_4_ = auVar75._16_4_ * 0.0;
  auVar80._20_4_ = auVar75._20_4_ * 0.0;
  auVar80._24_4_ = auVar75._24_4_ * 0.0;
  auVar80._28_4_ = auVar75._28_4_;
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 0x17 + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,ZEXT1632(auVar52));
  auVar70._0_4_ = auVar4._0_4_ * auVar75._0_4_;
  auVar70._4_4_ = auVar4._4_4_ * auVar75._4_4_;
  auVar70._8_4_ = auVar4._8_4_ * auVar75._8_4_;
  auVar70._12_4_ = auVar4._12_4_ * auVar75._12_4_;
  auVar70._16_4_ = auVar75._16_4_ * 0.0;
  auVar70._20_4_ = auVar75._20_4_ * 0.0;
  auVar70._24_4_ = auVar75._24_4_ * 0.0;
  auVar70._28_4_ = 0;
  auVar75 = vpminsd_avx2(auVar78,auVar85);
  auVar73 = vpminsd_avx2(auVar79,auVar83);
  auVar75 = vmaxps_avx(auVar75,auVar73);
  auVar73 = vpminsd_avx2(auVar80,auVar70);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar74._4_4_ = uVar104;
  auVar74._0_4_ = uVar104;
  auVar74._8_4_ = uVar104;
  auVar74._12_4_ = uVar104;
  auVar74._16_4_ = uVar104;
  auVar74._20_4_ = uVar104;
  auVar74._24_4_ = uVar104;
  auVar74._28_4_ = uVar104;
  auVar73 = vmaxps_avx512vl(auVar73,auVar74);
  auVar75 = vmaxps_avx(auVar75,auVar73);
  auVar73._8_4_ = 0x3f7ffffa;
  auVar73._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar73._12_4_ = 0x3f7ffffa;
  auVar73._16_4_ = 0x3f7ffffa;
  auVar73._20_4_ = 0x3f7ffffa;
  auVar73._24_4_ = 0x3f7ffffa;
  auVar73._28_4_ = 0x3f7ffffa;
  local_b8 = vmulps_avx512vl(auVar75,auVar73);
  auVar75 = vpmaxsd_avx2(auVar78,auVar85);
  auVar73 = vpmaxsd_avx2(auVar79,auVar83);
  auVar75 = vminps_avx(auVar75,auVar73);
  auVar73 = vpmaxsd_avx2(auVar80,auVar70);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar86._4_4_ = uVar104;
  auVar86._0_4_ = uVar104;
  auVar86._8_4_ = uVar104;
  auVar86._12_4_ = uVar104;
  auVar86._16_4_ = uVar104;
  auVar86._20_4_ = uVar104;
  auVar86._24_4_ = uVar104;
  auVar86._28_4_ = uVar104;
  auVar73 = vminps_avx512vl(auVar73,auVar86);
  auVar75 = vminps_avx(auVar75,auVar73);
  auVar76._8_4_ = 0x3f800003;
  auVar76._0_8_ = 0x3f8000033f800003;
  auVar76._12_4_ = 0x3f800003;
  auVar76._16_4_ = 0x3f800003;
  auVar76._20_4_ = 0x3f800003;
  auVar76._24_4_ = 0x3f800003;
  auVar76._28_4_ = 0x3f800003;
  auVar75 = vmulps_avx512vl(auVar75,auVar76);
  auVar73 = vpbroadcastd_avx512vl();
  uVar16 = vpcmpgtd_avx512vl(auVar73,_DAT_0205a920);
  uVar14 = vcmpps_avx512vl(local_b8,auVar75,2);
  bVar38 = (byte)((byte)uVar14 & (byte)uVar16) == 0;
  local_499 = !bVar38;
  if (bVar38) {
    return local_499;
  }
  uVar35 = (ulong)(byte)((byte)uVar14 & (byte)uVar16);
  pLVar36 = pre->ray_space + k;
  local_2d8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar238 = ZEXT1664(auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar240 = ZEXT1664(auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar241 = ZEXT1664(auVar41);
  auVar41 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar246 = ZEXT1664(auVar41);
  local_370 = pLVar36;
LAB_01d9a0aa:
  lVar33 = 0;
  for (uVar30 = uVar35; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
    lVar33 = lVar33 + 1;
  }
  uVar37 = *(uint *)(prim + 2);
  pGVar7 = (context->scene->geometries).items[uVar37].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar30 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)*(uint *)(prim + lVar33 * 4 + 6) *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar41 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar30);
  lVar33 = uVar30 + 1;
  auVar50 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar33);
  _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar4 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * uVar30);
  auVar51 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * lVar33);
  local_278 = vpbroadcastd_avx512vl();
  auVar52 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar52 = vinsertps_avx(auVar52,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar43 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * uVar30),
                       auVar41,auVar42);
  auVar44 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * lVar33),
                       auVar50,auVar42);
  auVar45 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + uVar30 * *(long *)&pGVar7[3].fnumTimeSegments),
                       auVar4,auVar42);
  auVar46 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + *(long *)&pGVar7[3].fnumTimeSegments * lVar33),
                       auVar51,auVar42);
  auVar109 = ZEXT816(0) << 0x40;
  auVar158._0_4_ = auVar50._0_4_ * 0.0;
  auVar158._4_4_ = auVar50._4_4_ * 0.0;
  auVar158._8_4_ = auVar50._8_4_ * 0.0;
  auVar158._12_4_ = auVar50._12_4_ * 0.0;
  auVar53 = vfmadd231ps_fma(auVar158,auVar44,auVar109);
  auVar47 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar43,auVar53);
  auVar170._0_4_ = auVar47._0_4_ + auVar41._0_4_;
  auVar170._4_4_ = auVar47._4_4_ + auVar41._4_4_;
  auVar170._8_4_ = auVar47._8_4_ + auVar41._8_4_;
  auVar170._12_4_ = auVar47._12_4_ + auVar41._12_4_;
  auVar54 = auVar238._0_16_;
  auVar47 = vfmadd231ps_avx512vl(auVar53,auVar43,auVar54);
  auVar48 = vfnmadd231ps_avx512vl(auVar47,auVar41,auVar54);
  auVar216._0_4_ = auVar51._0_4_ * 0.0;
  auVar216._4_4_ = auVar51._4_4_ * 0.0;
  auVar216._8_4_ = auVar51._8_4_ * 0.0;
  auVar216._12_4_ = auVar51._12_4_ * 0.0;
  auVar53 = vfmadd231ps_fma(auVar216,auVar46,auVar109);
  auVar47 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar45,auVar53);
  auVar227._0_4_ = auVar47._0_4_ + auVar4._0_4_;
  auVar227._4_4_ = auVar47._4_4_ + auVar4._4_4_;
  auVar227._8_4_ = auVar47._8_4_ + auVar4._8_4_;
  auVar227._12_4_ = auVar47._12_4_ + auVar4._12_4_;
  auVar47 = vfmadd231ps_avx512vl(auVar53,auVar45,auVar54);
  auVar49 = vfnmadd231ps_avx512vl(auVar47,auVar4,auVar54);
  auVar47 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar44,auVar50);
  auVar47 = vfmadd231ps_fma(auVar47,auVar43,auVar109);
  auVar55 = vfmadd231ps_fma(auVar47,auVar41,auVar109);
  auVar50 = vmulps_avx512vl(auVar50,auVar54);
  auVar50 = vfnmadd231ps_avx512vl(auVar50,auVar54,auVar44);
  auVar50 = vfmadd231ps_fma(auVar50,auVar109,auVar43);
  auVar43 = vfnmadd231ps_fma(auVar50,auVar109,auVar41);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar46,auVar51);
  auVar41 = vfmadd231ps_fma(auVar41,auVar45,auVar109);
  auVar47 = vfmadd231ps_fma(auVar41,auVar4,auVar109);
  auVar41 = vmulps_avx512vl(auVar51,auVar54);
  auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar54,auVar46);
  auVar41 = vfmadd231ps_fma(auVar41,auVar109,auVar45);
  auVar53 = vfnmadd231ps_fma(auVar41,auVar109,auVar4);
  auVar41 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar50 = vshufps_avx(auVar227,auVar227,0xc9);
  fVar126 = auVar48._0_4_;
  auVar61._0_4_ = fVar126 * auVar50._0_4_;
  fVar168 = auVar48._4_4_;
  auVar61._4_4_ = fVar168 * auVar50._4_4_;
  fVar169 = auVar48._8_4_;
  auVar61._8_4_ = fVar169 * auVar50._8_4_;
  fVar203 = auVar48._12_4_;
  auVar61._12_4_ = fVar203 * auVar50._12_4_;
  auVar50 = vfmsub231ps_fma(auVar61,auVar41,auVar227);
  auVar4 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar50 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar67._0_4_ = fVar126 * auVar50._0_4_;
  auVar67._4_4_ = fVar168 * auVar50._4_4_;
  auVar67._8_4_ = fVar169 * auVar50._8_4_;
  auVar67._12_4_ = fVar203 * auVar50._12_4_;
  auVar41 = vfmsub231ps_fma(auVar67,auVar41,auVar49);
  auVar51 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar41 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar50 = vshufps_avx(auVar47,auVar47,0xc9);
  fVar1 = auVar43._0_4_;
  auVar189._0_4_ = auVar50._0_4_ * fVar1;
  fVar103 = auVar43._4_4_;
  auVar189._4_4_ = auVar50._4_4_ * fVar103;
  fVar188 = auVar43._8_4_;
  auVar189._8_4_ = auVar50._8_4_ * fVar188;
  fVar201 = auVar43._12_4_;
  auVar189._12_4_ = auVar50._12_4_ * fVar201;
  auVar50 = vfmsub231ps_fma(auVar189,auVar41,auVar47);
  auVar47 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar50 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar190._0_4_ = auVar50._0_4_ * fVar1;
  auVar190._4_4_ = auVar50._4_4_ * fVar103;
  auVar190._8_4_ = auVar50._8_4_ * fVar188;
  auVar190._12_4_ = auVar50._12_4_ * fVar201;
  auVar41 = vfmsub231ps_fma(auVar190,auVar41,auVar53);
  auVar53 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar41 = vdpps_avx(auVar4,auVar4,0x7f);
  fVar202 = auVar41._0_4_;
  auVar191._4_12_ = ZEXT812(0) << 0x20;
  auVar191._0_4_ = fVar202;
  auVar50 = vrsqrt14ss_avx512f(auVar109,auVar191);
  auVar44 = vmulss_avx512f(auVar50,ZEXT416(0x3fc00000));
  auVar45 = vmulss_avx512f(auVar41,ZEXT416(0x3f000000));
  fVar106 = auVar50._0_4_;
  fVar107 = auVar44._0_4_ - auVar45._0_4_ * fVar106 * fVar106 * fVar106;
  fVar215 = fVar107 * auVar4._0_4_;
  fVar224 = fVar107 * auVar4._4_4_;
  fVar225 = fVar107 * auVar4._8_4_;
  fVar226 = fVar107 * auVar4._12_4_;
  auVar50 = vdpps_avx(auVar4,auVar51,0x7f);
  auVar144._0_4_ = fVar202 * auVar51._0_4_;
  auVar144._4_4_ = fVar202 * auVar51._4_4_;
  auVar144._8_4_ = fVar202 * auVar51._8_4_;
  auVar144._12_4_ = fVar202 * auVar51._12_4_;
  fVar202 = auVar50._0_4_;
  auVar138._0_4_ = fVar202 * auVar4._0_4_;
  auVar138._4_4_ = fVar202 * auVar4._4_4_;
  auVar138._8_4_ = fVar202 * auVar4._8_4_;
  auVar138._12_4_ = fVar202 * auVar4._12_4_;
  auVar4 = vsubps_avx(auVar144,auVar138);
  auVar50 = vrcp14ss_avx512f(auVar109,auVar191);
  auVar41 = vfnmadd213ss_avx512f(auVar41,auVar50,ZEXT416(0x40000000));
  fVar202 = auVar50._0_4_ * auVar41._0_4_;
  auVar41 = vdpps_avx(auVar47,auVar47,0x7f);
  fVar106 = auVar41._0_4_;
  auVar62._4_12_ = ZEXT812(0) << 0x20;
  auVar62._0_4_ = fVar106;
  auVar50 = vrsqrt14ss_avx512f(auVar109,auVar62);
  auVar51 = vmulss_avx512f(auVar50,ZEXT416(0x3fc00000));
  auVar44 = vmulss_avx512f(auVar41,ZEXT416(0x3f000000));
  fVar108 = auVar50._0_4_;
  fVar108 = auVar51._0_4_ - auVar44._0_4_ * fVar108 * fVar108 * fVar108;
  fVar204 = fVar108 * auVar47._0_4_;
  fVar212 = fVar108 * auVar47._4_4_;
  fVar213 = fVar108 * auVar47._8_4_;
  fVar214 = fVar108 * auVar47._12_4_;
  auVar50 = vdpps_avx(auVar47,auVar53,0x7f);
  auVar54._0_4_ = fVar106 * auVar53._0_4_;
  auVar54._4_4_ = fVar106 * auVar53._4_4_;
  auVar54._8_4_ = fVar106 * auVar53._8_4_;
  auVar54._12_4_ = fVar106 * auVar53._12_4_;
  fVar106 = auVar50._0_4_;
  auVar44._0_4_ = fVar106 * auVar47._0_4_;
  auVar44._4_4_ = fVar106 * auVar47._4_4_;
  auVar44._8_4_ = fVar106 * auVar47._8_4_;
  auVar44._12_4_ = fVar106 * auVar47._12_4_;
  auVar51 = vsubps_avx(auVar54,auVar44);
  auVar50 = vrcp14ss_avx512f(auVar109,auVar62);
  auVar41 = vfnmadd213ss_avx512f(auVar41,auVar50,ZEXT416(0x40000000));
  fVar106 = auVar50._0_4_ * auVar41._0_4_;
  auVar41 = vshufps_avx(auVar170,auVar170,0xff);
  auVar63._0_4_ = fVar215 * auVar41._0_4_;
  auVar63._4_4_ = fVar224 * auVar41._4_4_;
  auVar63._8_4_ = fVar225 * auVar41._8_4_;
  auVar63._12_4_ = fVar226 * auVar41._12_4_;
  local_1f8 = vsubps_avx(auVar170,auVar63);
  auVar50 = vshufps_avx(auVar48,auVar48,0xff);
  auVar58._0_4_ = fVar215 * auVar50._0_4_ + auVar41._0_4_ * fVar107 * auVar4._0_4_ * fVar202;
  auVar58._4_4_ = fVar224 * auVar50._4_4_ + auVar41._4_4_ * fVar107 * auVar4._4_4_ * fVar202;
  auVar58._8_4_ = fVar225 * auVar50._8_4_ + auVar41._8_4_ * fVar107 * auVar4._8_4_ * fVar202;
  auVar58._12_4_ = fVar226 * auVar50._12_4_ + auVar41._12_4_ * fVar107 * auVar4._12_4_ * fVar202;
  auVar4 = vsubps_avx(auVar48,auVar58);
  local_208._0_4_ = auVar170._0_4_ + auVar63._0_4_;
  local_208._4_4_ = auVar170._4_4_ + auVar63._4_4_;
  fStack_200 = auVar170._8_4_ + auVar63._8_4_;
  fStack_1fc = auVar170._12_4_ + auVar63._12_4_;
  auVar56._0_4_ = fVar126 + auVar58._0_4_;
  auVar56._4_4_ = fVar168 + auVar58._4_4_;
  auVar56._8_4_ = fVar169 + auVar58._8_4_;
  auVar56._12_4_ = fVar203 + auVar58._12_4_;
  auVar41 = vshufps_avx(auVar55,auVar55,0xff);
  auVar145._0_4_ = fVar204 * auVar41._0_4_;
  auVar145._4_4_ = fVar212 * auVar41._4_4_;
  auVar145._8_4_ = fVar213 * auVar41._8_4_;
  auVar145._12_4_ = fVar214 * auVar41._12_4_;
  local_218 = vsubps_avx(auVar55,auVar145);
  auVar50 = vshufps_avx(auVar43,auVar43,0xff);
  auVar45._0_4_ = fVar204 * auVar50._0_4_ + auVar41._0_4_ * fVar108 * auVar51._0_4_ * fVar106;
  auVar45._4_4_ = fVar212 * auVar50._4_4_ + auVar41._4_4_ * fVar108 * auVar51._4_4_ * fVar106;
  auVar45._8_4_ = fVar213 * auVar50._8_4_ + auVar41._8_4_ * fVar108 * auVar51._8_4_ * fVar106;
  auVar45._12_4_ = fVar214 * auVar50._12_4_ + auVar41._12_4_ * fVar108 * auVar51._12_4_ * fVar106;
  auVar41 = vsubps_avx(auVar43,auVar45);
  _local_228 = vaddps_avx512vl(auVar55,auVar145);
  auVar46._0_4_ = fVar1 + auVar45._0_4_;
  auVar46._4_4_ = fVar103 + auVar45._4_4_;
  auVar46._8_4_ = fVar188 + auVar45._8_4_;
  auVar46._12_4_ = fVar201 + auVar45._12_4_;
  auVar50 = vmulps_avx512vl(auVar4,auVar42);
  local_238 = vaddps_avx512vl(local_1f8,auVar50);
  auVar41 = vmulps_avx512vl(auVar41,auVar42);
  local_248 = vsubps_avx512vl(local_218,auVar41);
  auVar41 = vmulps_avx512vl(auVar56,auVar42);
  _local_258 = vaddps_avx512vl(_local_208,auVar41);
  auVar41 = vmulps_avx512vl(auVar46,auVar42);
  _local_268 = vsubps_avx512vl(_local_228,auVar41);
  local_178 = vsubps_avx(local_1f8,auVar52);
  uVar104 = local_178._0_4_;
  auVar48._4_4_ = uVar104;
  auVar48._0_4_ = uVar104;
  auVar48._8_4_ = uVar104;
  auVar48._12_4_ = uVar104;
  auVar41 = vshufps_avx(local_178,local_178,0x55);
  auVar50 = vshufps_avx(local_178,local_178,0xaa);
  aVar2 = (pLVar36->vx).field_0;
  aVar3 = (pLVar36->vy).field_0;
  fVar1 = (pLVar36->vz).field_0.m128[0];
  fVar103 = *(float *)((long)&(pLVar36->vz).field_0 + 4);
  fVar188 = *(float *)((long)&(pLVar36->vz).field_0 + 8);
  fVar201 = *(float *)((long)&(pLVar36->vz).field_0 + 0xc);
  auVar42._0_4_ = fVar1 * auVar50._0_4_;
  auVar42._4_4_ = fVar103 * auVar50._4_4_;
  auVar42._8_4_ = fVar188 * auVar50._8_4_;
  auVar42._12_4_ = fVar201 * auVar50._12_4_;
  auVar41 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar3,auVar41);
  auVar53 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar48);
  local_188 = vsubps_avx512vl(local_238,auVar52);
  uVar104 = local_188._0_4_;
  auVar68._4_4_ = uVar104;
  auVar68._0_4_ = uVar104;
  auVar68._8_4_ = uVar104;
  auVar68._12_4_ = uVar104;
  auVar41 = vshufps_avx(local_188,local_188,0x55);
  auVar50 = vshufps_avx(local_188,local_188,0xaa);
  auVar49._0_4_ = fVar1 * auVar50._0_4_;
  auVar49._4_4_ = fVar103 * auVar50._4_4_;
  auVar49._8_4_ = fVar188 * auVar50._8_4_;
  auVar49._12_4_ = fVar201 * auVar50._12_4_;
  auVar41 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar3,auVar41);
  auVar55 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar68);
  local_198 = vsubps_avx512vl(local_248,auVar52);
  uVar104 = local_198._0_4_;
  auVar57._4_4_ = uVar104;
  auVar57._0_4_ = uVar104;
  auVar57._8_4_ = uVar104;
  auVar57._12_4_ = uVar104;
  auVar41 = vshufps_avx(local_198,local_198,0x55);
  auVar50 = vshufps_avx(local_198,local_198,0xaa);
  auVar171._0_4_ = auVar50._0_4_ * fVar1;
  auVar171._4_4_ = auVar50._4_4_ * fVar103;
  auVar171._8_4_ = auVar50._8_4_ * fVar188;
  auVar171._12_4_ = auVar50._12_4_ * fVar201;
  auVar41 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar3,auVar41);
  auVar43 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar57);
  local_1a8 = vsubps_avx(local_218,auVar52);
  uVar104 = local_1a8._0_4_;
  auVar65._4_4_ = uVar104;
  auVar65._0_4_ = uVar104;
  auVar65._8_4_ = uVar104;
  auVar65._12_4_ = uVar104;
  auVar41 = vshufps_avx(local_1a8,local_1a8,0x55);
  auVar50 = vshufps_avx(local_1a8,local_1a8,0xaa);
  auVar181._0_4_ = auVar50._0_4_ * fVar1;
  auVar181._4_4_ = auVar50._4_4_ * fVar103;
  auVar181._8_4_ = auVar50._8_4_ * fVar188;
  auVar181._12_4_ = auVar50._12_4_ * fVar201;
  auVar41 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar3,auVar41);
  auVar42 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar65);
  local_1b8 = vsubps_avx(_local_208,auVar52);
  uVar104 = local_1b8._0_4_;
  auVar66._4_4_ = uVar104;
  auVar66._0_4_ = uVar104;
  auVar66._8_4_ = uVar104;
  auVar66._12_4_ = uVar104;
  auVar41 = vshufps_avx(local_1b8,local_1b8,0x55);
  auVar50 = vshufps_avx(local_1b8,local_1b8,0xaa);
  auVar192._0_4_ = auVar50._0_4_ * fVar1;
  auVar192._4_4_ = auVar50._4_4_ * fVar103;
  auVar192._8_4_ = auVar50._8_4_ * fVar188;
  auVar192._12_4_ = auVar50._12_4_ * fVar201;
  auVar41 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar3,auVar41);
  auVar44 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar66);
  local_1c8 = vsubps_avx512vl(_local_258,auVar52);
  uVar104 = local_1c8._0_4_;
  auVar64._4_4_ = uVar104;
  auVar64._0_4_ = uVar104;
  auVar64._8_4_ = uVar104;
  auVar64._12_4_ = uVar104;
  auVar41 = vshufps_avx(local_1c8,local_1c8,0x55);
  auVar50 = vshufps_avx(local_1c8,local_1c8,0xaa);
  auVar205._0_4_ = auVar50._0_4_ * fVar1;
  auVar205._4_4_ = auVar50._4_4_ * fVar103;
  auVar205._8_4_ = auVar50._8_4_ * fVar188;
  auVar205._12_4_ = auVar50._12_4_ * fVar201;
  auVar41 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar3,auVar41);
  auVar45 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar64);
  local_1d8 = vsubps_avx512vl(_local_268,auVar52);
  uVar104 = local_1d8._0_4_;
  auVar59._4_4_ = uVar104;
  auVar59._0_4_ = uVar104;
  auVar59._8_4_ = uVar104;
  auVar59._12_4_ = uVar104;
  auVar41 = vshufps_avx(local_1d8,local_1d8,0x55);
  auVar50 = vshufps_avx(local_1d8,local_1d8,0xaa);
  auVar217._0_4_ = auVar50._0_4_ * fVar1;
  auVar217._4_4_ = auVar50._4_4_ * fVar103;
  auVar217._8_4_ = auVar50._8_4_ * fVar188;
  auVar217._12_4_ = auVar50._12_4_ * fVar201;
  auVar41 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar3,auVar41);
  auVar46 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar59);
  local_1e8 = vsubps_avx512vl(_local_228,auVar52);
  uVar104 = local_1e8._0_4_;
  auVar60._4_4_ = uVar104;
  auVar60._0_4_ = uVar104;
  auVar60._8_4_ = uVar104;
  auVar60._12_4_ = uVar104;
  auVar41 = vshufps_avx(local_1e8,local_1e8,0x55);
  auVar50 = vshufps_avx(local_1e8,local_1e8,0xaa);
  auVar146._0_4_ = fVar1 * auVar50._0_4_;
  auVar146._4_4_ = fVar103 * auVar50._4_4_;
  auVar146._8_4_ = fVar188 * auVar50._8_4_;
  auVar146._12_4_ = fVar201 * auVar50._12_4_;
  auVar41 = vfmadd231ps_fma(auVar146,(undefined1  [16])aVar3,auVar41);
  auVar48 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar60);
  auVar4 = vmovlhps_avx(auVar53,auVar44);
  auVar51 = vmovlhps_avx(auVar55,auVar45);
  auVar47 = vmovlhps_avx512f(auVar43,auVar46);
  _local_348 = vmovlhps_avx512f(auVar42,auVar48);
  auVar50 = vminps_avx(auVar4,auVar51);
  auVar41 = vmaxps_avx(auVar4,auVar51);
  auVar52 = vminps_avx512vl(auVar47,_local_348);
  auVar50 = vminps_avx(auVar50,auVar52);
  auVar52 = vmaxps_avx512vl(auVar47,_local_348);
  auVar41 = vmaxps_avx(auVar41,auVar52);
  auVar52 = vshufpd_avx(auVar50,auVar50,3);
  auVar50 = vminps_avx(auVar50,auVar52);
  auVar52 = vshufpd_avx(auVar41,auVar41,3);
  auVar41 = vmaxps_avx(auVar41,auVar52);
  auVar50 = vandps_avx512vl(auVar50,auVar240._0_16_);
  auVar41 = vandps_avx512vl(auVar41,auVar240._0_16_);
  auVar41 = vmaxps_avx(auVar50,auVar41);
  auVar50 = vmovshdup_avx(auVar41);
  auVar41 = vmaxss_avx(auVar50,auVar41);
  local_328 = vmovddup_avx512vl(auVar53);
  local_338 = vmovddup_avx512vl(auVar55);
  auVar109._8_8_ = auVar43._0_8_;
  auVar109._0_8_ = auVar43._0_8_;
  auVar127._8_8_ = auVar42._0_8_;
  auVar127._0_8_ = auVar42._0_8_;
  local_358 = ZEXT416((uint)(auVar41._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_358);
  auVar41 = vxorps_avx512vl(local_78._0_16_,auVar241._0_16_);
  local_98 = vbroadcastss_avx512vl(auVar41);
  bVar38 = false;
  uVar30 = 0;
  fVar1 = *(float *)(ray + k * 4 + 0x30);
  auVar41 = vsubps_avx(auVar51,auVar4);
  auVar52 = vsubps_avx512vl(auVar47,auVar51);
  auVar53 = vsubps_avx512vl(_local_348,auVar47);
  local_288 = vsubps_avx(_local_208,local_1f8);
  local_298 = vsubps_avx512vl(_local_258,local_238);
  local_2a8 = vsubps_avx512vl(_local_268,local_248);
  _local_2b8 = vsubps_avx512vl(_local_228,local_218);
  local_2c8 = vpbroadcastd_avx512vl();
  auVar50 = ZEXT816(0x3f80000000000000);
  auVar237 = ZEXT1664(auVar50);
  do {
    auVar68 = auVar237._0_16_;
    auVar55 = vshufps_avx(auVar68,auVar68,0x50);
    auVar76 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar43 = vsubps_avx512vl(auVar76._0_16_,auVar55);
    fVar103 = auVar55._0_4_;
    fVar106 = auVar44._0_4_;
    auVar128._0_4_ = fVar106 * fVar103;
    fVar188 = auVar55._4_4_;
    fVar107 = auVar44._4_4_;
    auVar128._4_4_ = fVar107 * fVar188;
    fVar201 = auVar55._8_4_;
    auVar128._8_4_ = fVar106 * fVar201;
    fVar202 = auVar55._12_4_;
    auVar128._12_4_ = fVar107 * fVar202;
    fVar108 = auVar45._0_4_;
    auVar139._0_4_ = fVar108 * fVar103;
    fVar126 = auVar45._4_4_;
    auVar139._4_4_ = fVar126 * fVar188;
    auVar139._8_4_ = fVar108 * fVar201;
    auVar139._12_4_ = fVar126 * fVar202;
    fVar168 = auVar46._0_4_;
    auVar147._0_4_ = fVar168 * fVar103;
    fVar169 = auVar46._4_4_;
    auVar147._4_4_ = fVar169 * fVar188;
    auVar147._8_4_ = fVar168 * fVar201;
    auVar147._12_4_ = fVar169 * fVar202;
    fVar213 = auVar48._0_4_;
    auVar110._0_4_ = fVar213 * fVar103;
    fVar214 = auVar48._4_4_;
    auVar110._4_4_ = fVar214 * fVar188;
    auVar110._8_4_ = fVar213 * fVar201;
    auVar110._12_4_ = fVar214 * fVar202;
    auVar42 = vfmadd231ps_avx512vl(auVar128,auVar43,local_328);
    auVar49 = vfmadd231ps_avx512vl(auVar139,auVar43,local_338);
    auVar54 = vfmadd231ps_avx512vl(auVar147,auVar43,auVar109);
    auVar43 = vfmadd231ps_fma(auVar110,auVar127,auVar43);
    auVar55 = vmovshdup_avx(auVar50);
    fVar188 = auVar50._0_4_;
    fVar103 = (auVar55._0_4_ - fVar188) * 0.04761905;
    auVar167._4_4_ = fVar188;
    auVar167._0_4_ = fVar188;
    auVar167._8_4_ = fVar188;
    auVar167._12_4_ = fVar188;
    auVar167._16_4_ = fVar188;
    auVar167._20_4_ = fVar188;
    auVar167._24_4_ = fVar188;
    auVar167._28_4_ = fVar188;
    auVar123._0_8_ = auVar55._0_8_;
    auVar123._8_8_ = auVar123._0_8_;
    auVar123._16_8_ = auVar123._0_8_;
    auVar123._24_8_ = auVar123._0_8_;
    auVar75 = vsubps_avx(auVar123,auVar167);
    uVar104 = auVar42._0_4_;
    auVar124._4_4_ = uVar104;
    auVar124._0_4_ = uVar104;
    auVar124._8_4_ = uVar104;
    auVar124._12_4_ = uVar104;
    auVar124._16_4_ = uVar104;
    auVar124._20_4_ = uVar104;
    auVar124._24_4_ = uVar104;
    auVar124._28_4_ = uVar104;
    auVar185._8_4_ = 1;
    auVar185._0_8_ = 0x100000001;
    auVar185._12_4_ = 1;
    auVar185._16_4_ = 1;
    auVar185._20_4_ = 1;
    auVar185._24_4_ = 1;
    auVar185._28_4_ = 1;
    auVar74 = ZEXT1632(auVar42);
    auVar73 = vpermps_avx2(auVar185,auVar74);
    auVar77 = vbroadcastss_avx512vl(auVar49);
    auVar86 = ZEXT1632(auVar49);
    auVar78 = vpermps_avx512vl(auVar185,auVar86);
    auVar79 = vbroadcastss_avx512vl(auVar54);
    auVar83 = ZEXT1632(auVar54);
    auVar80 = vpermps_avx512vl(auVar185,auVar83);
    auVar81 = vbroadcastss_avx512vl(auVar43);
    auVar84 = ZEXT1632(auVar43);
    auVar71 = vpermps_avx512vl(auVar185,auVar84);
    auVar186._4_4_ = fVar103;
    auVar186._0_4_ = fVar103;
    auVar186._8_4_ = fVar103;
    auVar186._12_4_ = fVar103;
    auVar186._16_4_ = fVar103;
    auVar186._20_4_ = fVar103;
    auVar186._24_4_ = fVar103;
    auVar186._28_4_ = fVar103;
    auVar85 = auVar244._0_32_;
    auVar72 = vpermps_avx512vl(auVar85,auVar74);
    auVar156._8_4_ = 3;
    auVar156._0_8_ = 0x300000003;
    auVar156._12_4_ = 3;
    auVar156._16_4_ = 3;
    auVar156._20_4_ = 3;
    auVar156._24_4_ = 3;
    auVar156._28_4_ = 3;
    auVar82 = vpermps_avx512vl(auVar156,auVar74);
    auVar69 = vpermps_avx512vl(auVar85,auVar86);
    auVar74 = vpermps_avx2(auVar156,auVar86);
    auVar70 = vpermps_avx512vl(auVar85,auVar83);
    auVar86 = vpermps_avx2(auVar156,auVar83);
    auVar83 = vpermps_avx512vl(auVar85,auVar84);
    auVar84 = vpermps_avx512vl(auVar156,auVar84);
    auVar55 = vfmadd132ps_fma(auVar75,auVar167,_DAT_02020f20);
    auVar76 = vsubps_avx512vl(auVar76,ZEXT1632(auVar55));
    auVar75 = vmulps_avx512vl(auVar77,ZEXT1632(auVar55));
    auVar87 = ZEXT1632(auVar55);
    auVar85 = vmulps_avx512vl(auVar78,auVar87);
    auVar43 = vfmadd231ps_fma(auVar75,auVar76,auVar124);
    auVar42 = vfmadd231ps_fma(auVar85,auVar76,auVar73);
    auVar75 = vmulps_avx512vl(auVar79,auVar87);
    auVar85 = vmulps_avx512vl(auVar80,auVar87);
    auVar75 = vfmadd231ps_avx512vl(auVar75,auVar76,auVar77);
    auVar77 = vfmadd231ps_avx512vl(auVar85,auVar76,auVar78);
    auVar78 = vmulps_avx512vl(auVar81,auVar87);
    auVar85 = ZEXT1632(auVar55);
    auVar71 = vmulps_avx512vl(auVar71,auVar85);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar76,auVar79);
    auVar79 = vfmadd231ps_avx512vl(auVar71,auVar76,auVar80);
    fVar201 = auVar55._0_4_;
    fVar202 = auVar55._4_4_;
    auVar19._4_4_ = fVar202 * auVar75._4_4_;
    auVar19._0_4_ = fVar201 * auVar75._0_4_;
    fVar203 = auVar55._8_4_;
    auVar19._8_4_ = fVar203 * auVar75._8_4_;
    fVar204 = auVar55._12_4_;
    auVar19._12_4_ = fVar204 * auVar75._12_4_;
    auVar19._16_4_ = auVar75._16_4_ * 0.0;
    auVar19._20_4_ = auVar75._20_4_ * 0.0;
    auVar19._24_4_ = auVar75._24_4_ * 0.0;
    auVar19._28_4_ = fVar188;
    auVar20._4_4_ = fVar202 * auVar77._4_4_;
    auVar20._0_4_ = fVar201 * auVar77._0_4_;
    auVar20._8_4_ = fVar203 * auVar77._8_4_;
    auVar20._12_4_ = fVar204 * auVar77._12_4_;
    auVar20._16_4_ = auVar77._16_4_ * 0.0;
    auVar20._20_4_ = auVar77._20_4_ * 0.0;
    auVar20._24_4_ = auVar77._24_4_ * 0.0;
    auVar20._28_4_ = auVar73._28_4_;
    auVar43 = vfmadd231ps_fma(auVar19,auVar76,ZEXT1632(auVar43));
    auVar42 = vfmadd231ps_fma(auVar20,auVar76,ZEXT1632(auVar42));
    auVar116._0_4_ = fVar201 * auVar78._0_4_;
    auVar116._4_4_ = fVar202 * auVar78._4_4_;
    auVar116._8_4_ = fVar203 * auVar78._8_4_;
    auVar116._12_4_ = fVar204 * auVar78._12_4_;
    auVar116._16_4_ = auVar78._16_4_ * 0.0;
    auVar116._20_4_ = auVar78._20_4_ * 0.0;
    auVar116._24_4_ = auVar78._24_4_ * 0.0;
    auVar116._28_4_ = 0;
    auVar21._4_4_ = fVar202 * auVar79._4_4_;
    auVar21._0_4_ = fVar201 * auVar79._0_4_;
    auVar21._8_4_ = fVar203 * auVar79._8_4_;
    auVar21._12_4_ = fVar204 * auVar79._12_4_;
    auVar21._16_4_ = auVar79._16_4_ * 0.0;
    auVar21._20_4_ = auVar79._20_4_ * 0.0;
    auVar21._24_4_ = auVar79._24_4_ * 0.0;
    auVar21._28_4_ = auVar78._28_4_;
    auVar49 = vfmadd231ps_fma(auVar116,auVar76,auVar75);
    auVar54 = vfmadd231ps_fma(auVar21,auVar76,auVar77);
    auVar22._28_4_ = auVar77._28_4_;
    auVar22._0_28_ =
         ZEXT1628(CONCAT412(fVar204 * auVar54._12_4_,
                            CONCAT48(fVar203 * auVar54._8_4_,
                                     CONCAT44(fVar202 * auVar54._4_4_,fVar201 * auVar54._0_4_))));
    auVar58 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar204 * auVar49._12_4_,
                                                 CONCAT48(fVar203 * auVar49._8_4_,
                                                          CONCAT44(fVar202 * auVar49._4_4_,
                                                                   fVar201 * auVar49._0_4_)))),
                              auVar76,ZEXT1632(auVar43));
    auVar56 = vfmadd231ps_fma(auVar22,auVar76,ZEXT1632(auVar42));
    auVar75 = vsubps_avx(ZEXT1632(auVar49),ZEXT1632(auVar43));
    auVar73 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar42));
    auVar77 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar75 = vmulps_avx512vl(auVar75,auVar77);
    auVar73 = vmulps_avx512vl(auVar73,auVar77);
    auVar180._0_4_ = fVar103 * auVar75._0_4_;
    auVar180._4_4_ = fVar103 * auVar75._4_4_;
    auVar180._8_4_ = fVar103 * auVar75._8_4_;
    auVar180._12_4_ = fVar103 * auVar75._12_4_;
    auVar180._16_4_ = fVar103 * auVar75._16_4_;
    auVar180._20_4_ = fVar103 * auVar75._20_4_;
    auVar180._24_4_ = fVar103 * auVar75._24_4_;
    auVar180._28_4_ = 0;
    auVar75 = vmulps_avx512vl(auVar186,auVar73);
    auVar49 = vxorps_avx512vl(auVar81._0_16_,auVar81._0_16_);
    auVar78 = vpermt2ps_avx512vl(ZEXT1632(auVar58),_DAT_0205fd20,ZEXT1632(auVar49));
    auVar79 = vpermt2ps_avx512vl(ZEXT1632(auVar56),_DAT_0205fd20,ZEXT1632(auVar49));
    auVar117._0_4_ = auVar180._0_4_ + auVar58._0_4_;
    auVar117._4_4_ = auVar180._4_4_ + auVar58._4_4_;
    auVar117._8_4_ = auVar180._8_4_ + auVar58._8_4_;
    auVar117._12_4_ = auVar180._12_4_ + auVar58._12_4_;
    auVar117._16_4_ = auVar180._16_4_ + 0.0;
    auVar117._20_4_ = auVar180._20_4_ + 0.0;
    auVar117._24_4_ = auVar180._24_4_ + 0.0;
    auVar117._28_4_ = 0;
    auVar87 = ZEXT1632(auVar49);
    auVar73 = vpermt2ps_avx512vl(auVar180,_DAT_0205fd20,auVar87);
    auVar80 = vaddps_avx512vl(ZEXT1632(auVar56),auVar75);
    auVar81 = vpermt2ps_avx512vl(auVar75,_DAT_0205fd20,auVar87);
    auVar75 = vsubps_avx(auVar78,auVar73);
    auVar81 = vsubps_avx512vl(auVar79,auVar81);
    auVar73 = vmulps_avx512vl(auVar69,auVar85);
    auVar71 = vmulps_avx512vl(auVar74,auVar85);
    auVar73 = vfmadd231ps_avx512vl(auVar73,auVar76,auVar72);
    auVar71 = vfmadd231ps_avx512vl(auVar71,auVar76,auVar82);
    auVar72 = vmulps_avx512vl(auVar70,auVar85);
    auVar82 = vmulps_avx512vl(auVar86,auVar85);
    auVar72 = vfmadd231ps_avx512vl(auVar72,auVar76,auVar69);
    auVar74 = vfmadd231ps_avx512vl(auVar82,auVar76,auVar74);
    auVar82 = vmulps_avx512vl(auVar83,auVar85);
    auVar69 = vmulps_avx512vl(auVar84,auVar85);
    auVar43 = vfmadd231ps_fma(auVar82,auVar76,auVar70);
    auVar42 = vfmadd231ps_fma(auVar69,auVar76,auVar86);
    auVar82 = vmulps_avx512vl(auVar85,auVar72);
    auVar69 = vmulps_avx512vl(ZEXT1632(auVar55),auVar74);
    auVar73 = vfmadd231ps_avx512vl(auVar82,auVar76,auVar73);
    auVar71 = vfmadd231ps_avx512vl(auVar69,auVar76,auVar71);
    auVar72 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar204 * auVar43._12_4_,
                                            CONCAT48(fVar203 * auVar43._8_4_,
                                                     CONCAT44(fVar202 * auVar43._4_4_,
                                                              fVar201 * auVar43._0_4_)))),auVar76,
                         auVar72);
    auVar74 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar204 * auVar42._12_4_,
                                            CONCAT48(fVar203 * auVar42._8_4_,
                                                     CONCAT44(fVar202 * auVar42._4_4_,
                                                              fVar201 * auVar42._0_4_)))),auVar76,
                         auVar74);
    auVar23._4_4_ = fVar202 * auVar72._4_4_;
    auVar23._0_4_ = fVar201 * auVar72._0_4_;
    auVar23._8_4_ = fVar203 * auVar72._8_4_;
    auVar23._12_4_ = fVar204 * auVar72._12_4_;
    auVar23._16_4_ = auVar72._16_4_ * 0.0;
    auVar23._20_4_ = auVar72._20_4_ * 0.0;
    auVar23._24_4_ = auVar72._24_4_ * 0.0;
    auVar23._28_4_ = auVar86._28_4_;
    auVar24._4_4_ = fVar202 * auVar74._4_4_;
    auVar24._0_4_ = fVar201 * auVar74._0_4_;
    auVar24._8_4_ = fVar203 * auVar74._8_4_;
    auVar24._12_4_ = fVar204 * auVar74._12_4_;
    auVar24._16_4_ = auVar74._16_4_ * 0.0;
    auVar24._20_4_ = auVar74._20_4_ * 0.0;
    auVar24._24_4_ = auVar74._24_4_ * 0.0;
    auVar24._28_4_ = auVar70._28_4_;
    auVar86 = vfmadd231ps_avx512vl(auVar23,auVar76,auVar73);
    auVar76 = vfmadd231ps_avx512vl(auVar24,auVar71,auVar76);
    auVar73 = vsubps_avx512vl(auVar72,auVar73);
    auVar74 = vsubps_avx512vl(auVar74,auVar71);
    auVar73 = vmulps_avx512vl(auVar73,auVar77);
    auVar74 = vmulps_avx512vl(auVar74,auVar77);
    fVar188 = fVar103 * auVar73._0_4_;
    fVar201 = fVar103 * auVar73._4_4_;
    auVar25._4_4_ = fVar201;
    auVar25._0_4_ = fVar188;
    fVar202 = fVar103 * auVar73._8_4_;
    auVar25._8_4_ = fVar202;
    fVar203 = fVar103 * auVar73._12_4_;
    auVar25._12_4_ = fVar203;
    fVar204 = fVar103 * auVar73._16_4_;
    auVar25._16_4_ = fVar204;
    fVar212 = fVar103 * auVar73._20_4_;
    auVar25._20_4_ = fVar212;
    fVar103 = fVar103 * auVar73._24_4_;
    auVar25._24_4_ = fVar103;
    auVar25._28_4_ = auVar73._28_4_;
    auVar74 = vmulps_avx512vl(auVar186,auVar74);
    auVar77 = vpermt2ps_avx512vl(auVar86,_DAT_0205fd20,auVar87);
    auVar71 = vpermt2ps_avx512vl(auVar76,_DAT_0205fd20,auVar87);
    auVar187._0_4_ = auVar86._0_4_ + fVar188;
    auVar187._4_4_ = auVar86._4_4_ + fVar201;
    auVar187._8_4_ = auVar86._8_4_ + fVar202;
    auVar187._12_4_ = auVar86._12_4_ + fVar203;
    auVar187._16_4_ = auVar86._16_4_ + fVar204;
    auVar187._20_4_ = auVar86._20_4_ + fVar212;
    auVar187._24_4_ = auVar86._24_4_ + fVar103;
    auVar187._28_4_ = auVar86._28_4_ + auVar73._28_4_;
    auVar73 = vpermt2ps_avx512vl(auVar25,_DAT_0205fd20,ZEXT1632(auVar49));
    auVar72 = vaddps_avx512vl(auVar76,auVar74);
    auVar74 = vpermt2ps_avx512vl(auVar74,_DAT_0205fd20,ZEXT1632(auVar49));
    auVar73 = vsubps_avx(auVar77,auVar73);
    auVar74 = vsubps_avx512vl(auVar71,auVar74);
    auVar135 = ZEXT1632(auVar58);
    auVar82 = vsubps_avx512vl(auVar86,auVar135);
    auVar142 = ZEXT1632(auVar56);
    auVar69 = vsubps_avx512vl(auVar76,auVar142);
    auVar70 = vsubps_avx512vl(auVar77,auVar78);
    auVar82 = vaddps_avx512vl(auVar82,auVar70);
    auVar70 = vsubps_avx512vl(auVar71,auVar79);
    auVar69 = vaddps_avx512vl(auVar69,auVar70);
    auVar70 = vmulps_avx512vl(auVar142,auVar82);
    auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar135,auVar69);
    auVar83 = vmulps_avx512vl(auVar80,auVar82);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar117,auVar69);
    auVar84 = vmulps_avx512vl(auVar81,auVar82);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar75,auVar69);
    auVar85 = vmulps_avx512vl(auVar79,auVar82);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar78,auVar69);
    auVar87 = vmulps_avx512vl(auVar76,auVar82);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar86,auVar69);
    auVar88 = vmulps_avx512vl(auVar72,auVar82);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar187,auVar69);
    auVar89 = vmulps_avx512vl(auVar74,auVar82);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar73,auVar69);
    auVar82 = vmulps_avx512vl(auVar71,auVar82);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar77,auVar69);
    auVar69 = vminps_avx512vl(auVar70,auVar83);
    auVar70 = vmaxps_avx512vl(auVar70,auVar83);
    auVar83 = vminps_avx512vl(auVar84,auVar85);
    auVar69 = vminps_avx512vl(auVar69,auVar83);
    auVar83 = vmaxps_avx512vl(auVar84,auVar85);
    auVar70 = vmaxps_avx512vl(auVar70,auVar83);
    auVar83 = vminps_avx512vl(auVar87,auVar88);
    auVar84 = vmaxps_avx512vl(auVar87,auVar88);
    auVar85 = vminps_avx512vl(auVar89,auVar82);
    auVar83 = vminps_avx512vl(auVar83,auVar85);
    auVar69 = vminps_avx512vl(auVar69,auVar83);
    auVar82 = vmaxps_avx512vl(auVar89,auVar82);
    auVar82 = vmaxps_avx512vl(auVar84,auVar82);
    auVar82 = vmaxps_avx512vl(auVar70,auVar82);
    uVar14 = vcmpps_avx512vl(auVar69,local_78,2);
    uVar16 = vcmpps_avx512vl(auVar82,local_98,5);
    uVar32 = 0;
    bVar28 = (byte)uVar14 & (byte)uVar16 & 0x7f;
    if (bVar28 != 0) {
      auVar82 = vsubps_avx512vl(auVar78,auVar135);
      auVar69 = vsubps_avx512vl(auVar79,auVar142);
      auVar70 = vsubps_avx512vl(auVar77,auVar86);
      auVar82 = vaddps_avx512vl(auVar82,auVar70);
      auVar70 = vsubps_avx512vl(auVar71,auVar76);
      auVar69 = vaddps_avx512vl(auVar69,auVar70);
      auVar70 = vmulps_avx512vl(auVar142,auVar82);
      auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar69,auVar135);
      auVar80 = vmulps_avx512vl(auVar80,auVar82);
      auVar80 = vfnmadd213ps_avx512vl(auVar117,auVar69,auVar80);
      auVar81 = vmulps_avx512vl(auVar81,auVar82);
      auVar81 = vfnmadd213ps_avx512vl(auVar75,auVar69,auVar81);
      auVar75 = vmulps_avx512vl(auVar79,auVar82);
      auVar78 = vfnmadd231ps_avx512vl(auVar75,auVar69,auVar78);
      auVar75 = vmulps_avx512vl(auVar76,auVar82);
      auVar76 = vfnmadd231ps_avx512vl(auVar75,auVar69,auVar86);
      auVar75 = vmulps_avx512vl(auVar72,auVar82);
      auVar79 = vfnmadd213ps_avx512vl(auVar187,auVar69,auVar75);
      auVar75 = vmulps_avx512vl(auVar74,auVar82);
      auVar72 = vfnmadd213ps_avx512vl(auVar73,auVar69,auVar75);
      auVar75 = vmulps_avx512vl(auVar71,auVar82);
      auVar77 = vfnmadd231ps_avx512vl(auVar75,auVar77,auVar69);
      auVar73 = vminps_avx(auVar70,auVar80);
      auVar75 = vmaxps_avx(auVar70,auVar80);
      auVar74 = vminps_avx(auVar81,auVar78);
      auVar74 = vminps_avx(auVar73,auVar74);
      auVar73 = vmaxps_avx(auVar81,auVar78);
      auVar75 = vmaxps_avx(auVar75,auVar73);
      auVar86 = vminps_avx(auVar76,auVar79);
      auVar73 = vmaxps_avx(auVar76,auVar79);
      auVar76 = vminps_avx(auVar72,auVar77);
      auVar86 = vminps_avx(auVar86,auVar76);
      auVar86 = vminps_avx(auVar74,auVar86);
      auVar74 = vmaxps_avx(auVar72,auVar77);
      auVar73 = vmaxps_avx(auVar73,auVar74);
      auVar75 = vmaxps_avx(auVar75,auVar73);
      uVar14 = vcmpps_avx512vl(auVar75,local_98,5);
      uVar16 = vcmpps_avx512vl(auVar86,local_78,2);
      uVar32 = (uint)(bVar28 & (byte)uVar14 & (byte)uVar16);
    }
    if (uVar32 != 0) {
      auStack_318[uVar30] = uVar32;
      uVar14 = vmovlps_avx(auVar50);
      *(undefined8 *)(&uStack_168 + uVar30 * 2) = uVar14;
      uVar40 = vmovlps_avx512f(auVar68);
      auStack_58[uVar30] = uVar40;
      uVar30 = (ulong)((int)uVar30 + 1);
    }
    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar238 = ZEXT1664(auVar50);
    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar240 = ZEXT1664(auVar50);
    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar241 = ZEXT1664(auVar50);
    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar239 = ZEXT3264(auVar75);
    auVar242 = ZEXT464(0x3f800000);
    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar243 = ZEXT1664(auVar50);
    do {
      auVar50 = auVar243._0_16_;
      if ((int)uVar30 == 0) {
        if (bVar38) {
          return local_499;
        }
        uVar104 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar18._4_4_ = uVar104;
        auVar18._0_4_ = uVar104;
        auVar18._8_4_ = uVar104;
        auVar18._12_4_ = uVar104;
        auVar18._16_4_ = uVar104;
        auVar18._20_4_ = uVar104;
        auVar18._24_4_ = uVar104;
        auVar18._28_4_ = uVar104;
        uVar14 = vcmpps_avx512vl(local_b8,auVar18,2);
        uVar37 = (uint)uVar35 & (uint)uVar35 + 0xff & (uint)uVar14;
        uVar35 = (ulong)uVar37;
        local_499 = uVar37 != 0;
        if (!local_499) {
          return local_499;
        }
        goto LAB_01d9a0aa;
      }
      uVar29 = (int)uVar30 - 1;
      uVar31 = (ulong)uVar29;
      uVar32 = (&uStack_168)[uVar31 * 2];
      fVar103 = afStack_164[uVar31 * 2];
      uVar6 = auStack_318[uVar31];
      auVar235._8_8_ = 0;
      auVar235._0_8_ = auStack_58[uVar31];
      auVar237 = ZEXT1664(auVar235);
      lVar33 = 0;
      for (uVar40 = (ulong)uVar6; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
        lVar33 = lVar33 + 1;
      }
      uVar34 = uVar6 - 1 & uVar6;
      auStack_318[uVar31] = uVar34;
      if (uVar34 == 0) {
        uVar30 = (ulong)uVar29;
      }
      auVar118._0_4_ = (float)lVar33;
      auVar118._4_8_ = SUB128(ZEXT812(0),4);
      auVar118._12_4_ = 0;
      auVar55 = vmulss_avx512f(auVar118,SUB6416(ZEXT464(0x3e124925),0));
      lVar33 = lVar33 + 1;
      auVar129._0_4_ = (float)lVar33;
      auVar129._4_8_ = SUB128(ZEXT812(0),4);
      auVar129._12_4_ = 0;
      auVar43 = vmulss_avx512f(auVar129,SUB6416(ZEXT464(0x3e124925),0));
      auVar49 = auVar242._0_16_;
      auVar42 = vsubss_avx512f(auVar49,auVar55);
      auVar55 = vmulss_avx512f(ZEXT416((uint)fVar103),auVar55);
      auVar42 = vfmadd231ss_avx512f(auVar55,ZEXT416(uVar32),auVar42);
      auVar55 = vsubss_avx512f(auVar49,auVar43);
      auVar55 = vfmadd231ss_fma(ZEXT416((uint)(fVar103 * auVar43._0_4_)),ZEXT416(uVar32),auVar55);
      auVar43 = vsubss_avx512f(auVar55,auVar42);
      vucomiss_avx512f(auVar43);
      if (uVar6 == 0 || lVar33 == 0) break;
      auVar54 = vshufps_avx(auVar235,auVar235,0x50);
      vucomiss_avx512f(auVar43);
      auVar56 = vsubps_avx512vl(auVar50,auVar54);
      fVar103 = auVar54._0_4_;
      auVar130._0_4_ = fVar106 * fVar103;
      fVar188 = auVar54._4_4_;
      auVar130._4_4_ = fVar107 * fVar188;
      fVar201 = auVar54._8_4_;
      auVar130._8_4_ = fVar106 * fVar201;
      fVar202 = auVar54._12_4_;
      auVar130._12_4_ = fVar107 * fVar202;
      auVar140._0_4_ = fVar108 * fVar103;
      auVar140._4_4_ = fVar126 * fVar188;
      auVar140._8_4_ = fVar108 * fVar201;
      auVar140._12_4_ = fVar126 * fVar202;
      auVar148._0_4_ = fVar168 * fVar103;
      auVar148._4_4_ = fVar169 * fVar188;
      auVar148._8_4_ = fVar168 * fVar201;
      auVar148._12_4_ = fVar169 * fVar202;
      auVar111._0_4_ = fVar213 * fVar103;
      auVar111._4_4_ = fVar214 * fVar188;
      auVar111._8_4_ = fVar213 * fVar201;
      auVar111._12_4_ = fVar214 * fVar202;
      auVar54 = vfmadd231ps_fma(auVar130,auVar56,local_328);
      auVar58 = vfmadd231ps_fma(auVar140,auVar56,local_338);
      auVar57 = vfmadd231ps_avx512vl(auVar148,auVar56,auVar109);
      auVar56 = vfmadd231ps_fma(auVar111,auVar127,auVar56);
      auVar125._16_16_ = auVar54;
      auVar125._0_16_ = auVar54;
      auVar136._16_16_ = auVar58;
      auVar136._0_16_ = auVar58;
      auVar143._16_16_ = auVar57;
      auVar143._0_16_ = auVar57;
      auVar157._0_4_ = auVar42._0_4_;
      auVar157._4_4_ = auVar157._0_4_;
      auVar157._8_4_ = auVar157._0_4_;
      auVar157._12_4_ = auVar157._0_4_;
      uVar104 = auVar55._0_4_;
      auVar157._20_4_ = uVar104;
      auVar157._16_4_ = uVar104;
      auVar157._24_4_ = uVar104;
      auVar157._28_4_ = uVar104;
      auVar75 = vsubps_avx(auVar136,auVar125);
      auVar58 = vfmadd213ps_fma(auVar75,auVar157,auVar125);
      auVar75 = vsubps_avx(auVar143,auVar136);
      auVar68 = vfmadd213ps_fma(auVar75,auVar157,auVar136);
      auVar54 = vsubps_avx(auVar56,auVar57);
      auVar137._16_16_ = auVar54;
      auVar137._0_16_ = auVar54;
      auVar54 = vfmadd213ps_fma(auVar137,auVar157,auVar143);
      auVar75 = vsubps_avx(ZEXT1632(auVar68),ZEXT1632(auVar58));
      auVar58 = vfmadd213ps_fma(auVar75,auVar157,ZEXT1632(auVar58));
      auVar75 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar68));
      auVar54 = vfmadd213ps_fma(auVar75,auVar157,ZEXT1632(auVar68));
      auVar75 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar58));
      auVar63 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar75,auVar157);
      auVar75 = vmulps_avx512vl(auVar75,auVar239._0_32_);
      auVar67 = auVar75._16_16_;
      fVar103 = auVar43._0_4_ * 0.33333334;
      auVar149._0_8_ =
           CONCAT44(auVar63._4_4_ + fVar103 * auVar75._4_4_,auVar63._0_4_ + fVar103 * auVar75._0_4_)
      ;
      auVar149._8_4_ = auVar63._8_4_ + fVar103 * auVar75._8_4_;
      auVar149._12_4_ = auVar63._12_4_ + fVar103 * auVar75._12_4_;
      auVar131._0_4_ = fVar103 * auVar75._16_4_;
      auVar131._4_4_ = fVar103 * auVar75._20_4_;
      auVar131._8_4_ = fVar103 * auVar75._24_4_;
      auVar131._12_4_ = fVar103 * auVar75._28_4_;
      auVar138 = vsubps_avx((undefined1  [16])0x0,auVar131);
      auVar66 = vshufpd_avx(auVar63,auVar63,3);
      auVar64 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar54 = vsubps_avx(auVar66,auVar63);
      auVar58 = vsubps_avx(auVar64,(undefined1  [16])0x0);
      auVar159._0_4_ = auVar58._0_4_ + auVar54._0_4_;
      auVar159._4_4_ = auVar58._4_4_ + auVar54._4_4_;
      auVar159._8_4_ = auVar58._8_4_ + auVar54._8_4_;
      auVar159._12_4_ = auVar58._12_4_ + auVar54._12_4_;
      auVar54 = vshufps_avx(auVar63,auVar63,0xb1);
      auVar58 = vshufps_avx(auVar149,auVar149,0xb1);
      auVar56 = vshufps_avx(auVar138,auVar138,0xb1);
      auVar68 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar218._4_4_ = auVar159._0_4_;
      auVar218._0_4_ = auVar159._0_4_;
      auVar218._8_4_ = auVar159._0_4_;
      auVar218._12_4_ = auVar159._0_4_;
      auVar57 = vshufps_avx(auVar159,auVar159,0x55);
      fVar103 = auVar57._0_4_;
      auVar172._0_4_ = auVar54._0_4_ * fVar103;
      fVar188 = auVar57._4_4_;
      auVar172._4_4_ = auVar54._4_4_ * fVar188;
      fVar201 = auVar57._8_4_;
      auVar172._8_4_ = auVar54._8_4_ * fVar201;
      fVar202 = auVar57._12_4_;
      auVar172._12_4_ = auVar54._12_4_ * fVar202;
      auVar182._0_4_ = auVar58._0_4_ * fVar103;
      auVar182._4_4_ = auVar58._4_4_ * fVar188;
      auVar182._8_4_ = auVar58._8_4_ * fVar201;
      auVar182._12_4_ = auVar58._12_4_ * fVar202;
      auVar193._0_4_ = auVar56._0_4_ * fVar103;
      auVar193._4_4_ = auVar56._4_4_ * fVar188;
      auVar193._8_4_ = auVar56._8_4_ * fVar201;
      auVar193._12_4_ = auVar56._12_4_ * fVar202;
      auVar160._0_4_ = auVar68._0_4_ * fVar103;
      auVar160._4_4_ = auVar68._4_4_ * fVar188;
      auVar160._8_4_ = auVar68._8_4_ * fVar201;
      auVar160._12_4_ = auVar68._12_4_ * fVar202;
      auVar54 = vfmadd231ps_fma(auVar172,auVar218,auVar63);
      auVar58 = vfmadd231ps_fma(auVar182,auVar218,auVar149);
      auVar57 = vfmadd231ps_fma(auVar193,auVar218,auVar138);
      auVar62 = vfmadd231ps_fma(auVar160,(undefined1  [16])0x0,auVar218);
      auVar65 = vshufpd_avx(auVar54,auVar54,1);
      auVar59 = vshufpd_avx(auVar58,auVar58,1);
      auVar60 = vshufpd_avx(auVar57,auVar57,1);
      auVar61 = vshufpd_avx(auVar62,auVar62,1);
      auVar56 = vminss_avx(auVar54,auVar58);
      auVar54 = vmaxss_avx(auVar58,auVar54);
      auVar68 = vminss_avx(auVar57,auVar62);
      auVar58 = vmaxss_avx(auVar62,auVar57);
      auVar68 = vminss_avx(auVar56,auVar68);
      auVar54 = vmaxss_avx(auVar58,auVar54);
      auVar57 = vminss_avx(auVar65,auVar59);
      auVar58 = vmaxss_avx(auVar59,auVar65);
      auVar65 = vminss_avx(auVar60,auVar61);
      auVar56 = vmaxss_avx(auVar61,auVar60);
      auVar57 = vminss_avx(auVar57,auVar65);
      auVar58 = vmaxss_avx(auVar56,auVar58);
      fVar201 = auVar68._0_4_;
      fVar188 = auVar58._0_4_;
      fVar103 = auVar54._0_4_;
      if ((0.0001 <= fVar201) || (fVar188 <= -0.0001)) {
        uVar14 = vcmpps_avx512vl(auVar57,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar16 = vcmpps_avx512vl(auVar68,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar103 & ((byte)uVar16 | (byte)uVar14)) != 0) goto LAB_01d9af9b;
        uVar14 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar58,5);
        uVar16 = vcmpps_avx512vl(auVar57,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar16 | (ushort)uVar14) & 1) == 0) goto LAB_01d9af9b;
        bVar15 = true;
        auVar237 = ZEXT1664(auVar235);
      }
      else {
LAB_01d9af9b:
        auVar59 = auVar246._0_16_;
        uVar14 = vcmpss_avx512f(auVar68,auVar59,1);
        bVar15 = (bool)((byte)uVar14 & 1);
        iVar102 = auVar242._0_4_;
        fVar202 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar102);
        uVar14 = vcmpss_avx512f(auVar54,auVar59,1);
        bVar15 = (bool)((byte)uVar14 & 1);
        fVar203 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar102);
        bVar15 = fVar202 != fVar203;
        iVar245 = auVar246._0_4_;
        auVar91._16_16_ = auVar67;
        auVar91._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar90._4_28_ = auVar91._4_28_;
        auVar90._0_4_ = (uint)bVar15 * iVar245 + (uint)!bVar15 * 0x7f800000;
        auVar65 = auVar90._0_16_;
        auVar93._16_16_ = auVar67;
        auVar93._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar92._4_28_ = auVar93._4_28_;
        auVar92._0_4_ = (uint)bVar15 * iVar245 + (uint)!bVar15 * -0x800000;
        auVar56 = auVar92._0_16_;
        uVar14 = vcmpss_avx512f(auVar57,auVar59,1);
        bVar15 = (bool)((byte)uVar14 & 1);
        fVar204 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar102);
        if ((fVar202 != fVar204) || (NAN(fVar202) || NAN(fVar204))) {
          fVar202 = auVar57._0_4_;
          bVar15 = fVar202 == fVar201;
          if ((!bVar15) || (NAN(fVar202) || NAN(fVar201))) {
            auVar68 = vxorps_avx512vl(auVar68,auVar241._0_16_);
            auVar230._0_4_ = auVar68._0_4_ / (fVar202 - fVar201);
            auVar230._4_12_ = auVar68._4_12_;
            auVar68 = vsubss_avx512f(auVar49,auVar230);
            auVar57 = vfmadd213ss_avx512f(auVar68,auVar59,auVar230);
            auVar68 = auVar57;
          }
          else {
            vucomiss_avx512f(auVar59);
            auVar95._16_16_ = auVar67;
            auVar95._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar94._4_28_ = auVar95._4_28_;
            auVar94._0_4_ = (uint)bVar15 * iVar245 + (uint)!bVar15 * 0x7f800000;
            auVar57 = auVar94._0_16_;
            auVar68 = ZEXT416((uint)bVar15 * 0x3f800000 + (uint)!bVar15 * -0x800000);
          }
          auVar65 = vminss_avx(auVar65,auVar57);
          auVar56 = vmaxss_avx(auVar68,auVar56);
        }
        uVar14 = vcmpss_avx512f(auVar58,auVar59,1);
        bVar15 = (bool)((byte)uVar14 & 1);
        fVar201 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar102);
        if ((fVar203 != fVar201) || (NAN(fVar203) || NAN(fVar201))) {
          bVar15 = fVar188 == fVar103;
          if ((!bVar15) || (NAN(fVar188) || NAN(fVar103))) {
            auVar54 = vxorps_avx512vl(auVar54,auVar241._0_16_);
            auVar194._0_4_ = auVar54._0_4_ / (fVar188 - fVar103);
            auVar194._4_12_ = auVar54._4_12_;
            auVar54 = vsubss_avx512f(auVar49,auVar194);
            auVar58 = vfmadd213ss_avx512f(auVar54,auVar59,auVar194);
            auVar54 = auVar58;
          }
          else {
            vucomiss_avx512f(auVar59);
            auVar97._16_16_ = auVar67;
            auVar97._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar96._4_28_ = auVar97._4_28_;
            auVar96._0_4_ = (uint)bVar15 * iVar245 + (uint)!bVar15 * 0x7f800000;
            auVar58 = auVar96._0_16_;
            auVar54 = ZEXT416((uint)bVar15 * 0x3f800000 + (uint)!bVar15 * -0x800000);
          }
          auVar65 = vminss_avx(auVar65,auVar58);
          auVar56 = vmaxss_avx(auVar54,auVar56);
        }
        bVar15 = fVar204 != fVar201;
        auVar54 = vminss_avx512f(auVar65,auVar49);
        auVar99._16_16_ = auVar67;
        auVar99._0_16_ = auVar65;
        auVar98._4_28_ = auVar99._4_28_;
        auVar98._0_4_ = (uint)bVar15 * auVar54._0_4_ + (uint)!bVar15 * auVar65._0_4_;
        auVar54 = vmaxss_avx512f(auVar49,auVar56);
        auVar101._16_16_ = auVar67;
        auVar101._0_16_ = auVar56;
        auVar100._4_28_ = auVar101._4_28_;
        auVar100._0_4_ = (uint)bVar15 * auVar54._0_4_ + (uint)!bVar15 * auVar56._0_4_;
        auVar54 = vmaxss_avx512f(auVar59,auVar98._0_16_);
        auVar58 = vminss_avx512f(auVar100._0_16_,auVar49);
        bVar15 = true;
        if (auVar54._0_4_ <= auVar58._0_4_) {
          auVar59 = vmaxss_avx512f(auVar59,ZEXT416((uint)(auVar54._0_4_ + -0.1)));
          auVar60 = vminss_avx512f(ZEXT416((uint)(auVar58._0_4_ + 0.1)),auVar49);
          auVar112._0_8_ = auVar63._0_8_;
          auVar112._8_8_ = auVar112._0_8_;
          auVar183._8_8_ = auVar149._0_8_;
          auVar183._0_8_ = auVar149._0_8_;
          auVar195._8_8_ = auVar138._0_8_;
          auVar195._0_8_ = auVar138._0_8_;
          auVar54 = vshufpd_avx(auVar149,auVar149,3);
          auVar58 = vshufpd_avx(auVar138,auVar138,3);
          auVar56 = vshufps_avx(auVar59,auVar60,0);
          auVar61 = vsubps_avx512vl(auVar50,auVar56);
          fVar103 = auVar56._0_4_;
          auVar228._0_4_ = fVar103 * auVar66._0_4_;
          fVar188 = auVar56._4_4_;
          auVar228._4_4_ = fVar188 * auVar66._4_4_;
          fVar201 = auVar56._8_4_;
          auVar228._8_4_ = fVar201 * auVar66._8_4_;
          fVar202 = auVar56._12_4_;
          auVar228._12_4_ = fVar202 * auVar66._12_4_;
          auVar150._0_4_ = fVar103 * auVar54._0_4_;
          auVar150._4_4_ = fVar188 * auVar54._4_4_;
          auVar150._8_4_ = fVar201 * auVar54._8_4_;
          auVar150._12_4_ = fVar202 * auVar54._12_4_;
          auVar153._0_4_ = fVar103 * auVar58._0_4_;
          auVar153._4_4_ = fVar188 * auVar58._4_4_;
          auVar153._8_4_ = fVar201 * auVar58._8_4_;
          auVar153._12_4_ = fVar202 * auVar58._12_4_;
          auVar132._0_4_ = fVar103 * auVar64._0_4_;
          auVar132._4_4_ = fVar188 * auVar64._4_4_;
          auVar132._8_4_ = fVar201 * auVar64._8_4_;
          auVar132._12_4_ = fVar202 * auVar64._12_4_;
          auVar68 = vfmadd231ps_fma(auVar228,auVar61,auVar112);
          auVar57 = vfmadd231ps_fma(auVar150,auVar61,auVar183);
          auVar65 = vfmadd231ps_fma(auVar153,auVar61,auVar195);
          auVar66 = vfmadd231ps_fma(auVar132,auVar61,ZEXT816(0));
          auVar54 = vsubss_avx512f(auVar49,auVar59);
          auVar58 = vmovshdup_avx512vl(auVar235);
          auVar62 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar58._0_4_ * auVar59._0_4_)),auVar235,
                                        auVar54);
          auVar54 = vsubss_avx512f(auVar49,auVar60);
          auVar63 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar60._0_4_ * auVar58._0_4_)),auVar235,
                                        auVar54);
          auVar64 = vdivss_avx512f(auVar49,auVar43);
          auVar43 = vsubps_avx(auVar57,auVar68);
          auVar144 = auVar238._0_16_;
          auVar58 = vmulps_avx512vl(auVar43,auVar144);
          auVar43 = vsubps_avx(auVar65,auVar57);
          auVar56 = vmulps_avx512vl(auVar43,auVar144);
          auVar43 = vsubps_avx(auVar66,auVar65);
          auVar43 = vmulps_avx512vl(auVar43,auVar144);
          auVar54 = vminps_avx(auVar56,auVar43);
          auVar43 = vmaxps_avx(auVar56,auVar43);
          auVar54 = vminps_avx(auVar58,auVar54);
          auVar43 = vmaxps_avx(auVar58,auVar43);
          auVar58 = vshufpd_avx(auVar54,auVar54,3);
          auVar56 = vshufpd_avx(auVar43,auVar43,3);
          auVar54 = vminps_avx(auVar54,auVar58);
          auVar43 = vmaxps_avx(auVar43,auVar56);
          fVar103 = auVar64._0_4_;
          auVar173._0_4_ = fVar103 * auVar54._0_4_;
          auVar173._4_4_ = fVar103 * auVar54._4_4_;
          auVar173._8_4_ = fVar103 * auVar54._8_4_;
          auVar173._12_4_ = fVar103 * auVar54._12_4_;
          auVar161._0_4_ = fVar103 * auVar43._0_4_;
          auVar161._4_4_ = fVar103 * auVar43._4_4_;
          auVar161._8_4_ = fVar103 * auVar43._8_4_;
          auVar161._12_4_ = fVar103 * auVar43._12_4_;
          auVar64 = vdivss_avx512f(auVar49,ZEXT416((uint)(auVar63._0_4_ - auVar62._0_4_)));
          auVar43 = vshufpd_avx(auVar68,auVar68,3);
          auVar54 = vshufpd_avx(auVar57,auVar57,3);
          auVar58 = vshufpd_avx(auVar65,auVar65,3);
          auVar56 = vshufpd_avx(auVar66,auVar66,3);
          auVar43 = vsubps_avx(auVar43,auVar68);
          auVar68 = vsubps_avx(auVar54,auVar57);
          auVar57 = vsubps_avx(auVar58,auVar65);
          auVar56 = vsubps_avx(auVar56,auVar66);
          auVar54 = vminps_avx(auVar43,auVar68);
          auVar43 = vmaxps_avx(auVar43,auVar68);
          auVar58 = vminps_avx(auVar57,auVar56);
          auVar58 = vminps_avx(auVar54,auVar58);
          auVar54 = vmaxps_avx(auVar57,auVar56);
          auVar43 = vmaxps_avx(auVar43,auVar54);
          fVar103 = auVar64._0_4_;
          auVar196._0_4_ = fVar103 * auVar58._0_4_;
          auVar196._4_4_ = fVar103 * auVar58._4_4_;
          auVar196._8_4_ = fVar103 * auVar58._8_4_;
          auVar196._12_4_ = fVar103 * auVar58._12_4_;
          auVar206._0_4_ = fVar103 * auVar43._0_4_;
          auVar206._4_4_ = fVar103 * auVar43._4_4_;
          auVar206._8_4_ = fVar103 * auVar43._8_4_;
          auVar206._12_4_ = fVar103 * auVar43._12_4_;
          auVar138 = vinsertps_avx512f(auVar42,auVar62,0x10);
          auVar68 = vinsertps_avx(auVar55,auVar63,0x10);
          auVar105._0_4_ = auVar138._0_4_ + auVar68._0_4_;
          auVar105._4_4_ = auVar138._4_4_ + auVar68._4_4_;
          auVar105._8_4_ = auVar138._8_4_ + auVar68._8_4_;
          auVar105._12_4_ = auVar138._12_4_ + auVar68._12_4_;
          auVar17._8_4_ = 0x3f000000;
          auVar17._0_8_ = 0x3f0000003f000000;
          auVar17._12_4_ = 0x3f000000;
          auVar60 = vmulps_avx512vl(auVar105,auVar17);
          auVar58 = vshufps_avx(auVar60,auVar60,0x54);
          uVar104 = auVar60._0_4_;
          auVar119._4_4_ = uVar104;
          auVar119._0_4_ = uVar104;
          auVar119._8_4_ = uVar104;
          auVar119._12_4_ = uVar104;
          auVar54 = vfmadd213ps_fma(auVar41,auVar119,auVar4);
          auVar57 = vfmadd213ps_avx512vl(auVar52,auVar119,auVar51);
          auVar56 = vfmadd213ps_fma(auVar53,auVar119,auVar47);
          auVar43 = vsubps_avx(auVar57,auVar54);
          auVar54 = vfmadd213ps_fma(auVar43,auVar119,auVar54);
          auVar43 = vsubps_avx(auVar56,auVar57);
          auVar43 = vfmadd213ps_fma(auVar43,auVar119,auVar57);
          auVar43 = vsubps_avx(auVar43,auVar54);
          auVar54 = vfmadd231ps_fma(auVar54,auVar43,auVar119);
          auVar65 = vmulps_avx512vl(auVar43,auVar144);
          auVar219._8_8_ = auVar54._0_8_;
          auVar219._0_8_ = auVar54._0_8_;
          auVar43 = vshufpd_avx(auVar54,auVar54,3);
          auVar54 = vshufps_avx(auVar60,auVar60,0x55);
          auVar56 = vsubps_avx(auVar43,auVar219);
          auVar57 = vfmadd231ps_fma(auVar219,auVar54,auVar56);
          auVar231._8_8_ = auVar65._0_8_;
          auVar231._0_8_ = auVar65._0_8_;
          auVar43 = vshufpd_avx(auVar65,auVar65,3);
          auVar43 = vsubps_avx(auVar43,auVar231);
          auVar54 = vfmadd213ps_fma(auVar43,auVar54,auVar231);
          auVar120._0_8_ = auVar56._0_8_ ^ 0x8000000080000000;
          auVar120._8_4_ = auVar56._8_4_ ^ 0x80000000;
          auVar120._12_4_ = auVar56._12_4_ ^ 0x80000000;
          auVar43 = vmovshdup_avx(auVar54);
          auVar232._0_8_ = auVar43._0_8_ ^ 0x8000000080000000;
          auVar232._8_4_ = auVar43._8_4_ ^ 0x80000000;
          auVar232._12_4_ = auVar43._12_4_ ^ 0x80000000;
          auVar65 = vmovshdup_avx512vl(auVar56);
          auVar66 = vpermt2ps_avx512vl(auVar232,ZEXT416(5),auVar56);
          auVar43 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar43._0_4_ * auVar56._0_4_)),auVar54,
                                        auVar65);
          auVar54 = vpermt2ps_avx512vl(auVar54,SUB6416(ZEXT464(4),0),auVar120);
          auVar133._0_4_ = auVar43._0_4_;
          auVar133._4_4_ = auVar133._0_4_;
          auVar133._8_4_ = auVar133._0_4_;
          auVar133._12_4_ = auVar133._0_4_;
          auVar43 = vdivps_avx(auVar66,auVar133);
          auVar54 = vdivps_avx(auVar54,auVar133);
          fVar188 = auVar57._0_4_;
          auVar56 = vshufps_avx(auVar57,auVar57,0x55);
          fVar103 = auVar54._0_4_;
          auVar220._0_4_ = fVar188 * auVar43._0_4_ + auVar56._0_4_ * fVar103;
          auVar220._4_4_ = fVar188 * auVar43._4_4_ + auVar56._4_4_ * auVar54._4_4_;
          auVar220._8_4_ = fVar188 * auVar43._8_4_ + auVar56._8_4_ * auVar54._8_4_;
          auVar220._12_4_ = fVar188 * auVar43._12_4_ + auVar56._12_4_ * auVar54._12_4_;
          auVar61 = vsubps_avx(auVar58,auVar220);
          auVar57 = vmovshdup_avx(auVar43);
          auVar58 = vinsertps_avx(auVar173,auVar196,0x1c);
          auVar233._0_4_ = auVar57._0_4_ * auVar58._0_4_;
          auVar233._4_4_ = auVar57._4_4_ * auVar58._4_4_;
          auVar233._8_4_ = auVar57._8_4_ * auVar58._8_4_;
          auVar233._12_4_ = auVar57._12_4_ * auVar58._12_4_;
          auVar56 = vinsertps_avx(auVar161,auVar206,0x1c);
          auVar221._0_4_ = auVar57._0_4_ * auVar56._0_4_;
          auVar221._4_4_ = auVar57._4_4_ * auVar56._4_4_;
          auVar221._8_4_ = auVar57._8_4_ * auVar56._8_4_;
          auVar221._12_4_ = auVar57._12_4_ * auVar56._12_4_;
          auVar59 = vminps_avx512vl(auVar233,auVar221);
          auVar66 = vmaxps_avx(auVar221,auVar233);
          auVar64 = vmovshdup_avx(auVar54);
          auVar57 = vinsertps_avx(auVar196,auVar173,0x4c);
          auVar197._0_4_ = auVar64._0_4_ * auVar57._0_4_;
          auVar197._4_4_ = auVar64._4_4_ * auVar57._4_4_;
          auVar197._8_4_ = auVar64._8_4_ * auVar57._8_4_;
          auVar197._12_4_ = auVar64._12_4_ * auVar57._12_4_;
          auVar65 = vinsertps_avx(auVar206,auVar161,0x4c);
          auVar207._0_4_ = auVar64._0_4_ * auVar65._0_4_;
          auVar207._4_4_ = auVar64._4_4_ * auVar65._4_4_;
          auVar207._8_4_ = auVar64._8_4_ * auVar65._8_4_;
          auVar207._12_4_ = auVar64._12_4_ * auVar65._12_4_;
          auVar64 = vminps_avx(auVar197,auVar207);
          auVar59 = vaddps_avx512vl(auVar59,auVar64);
          auVar64 = vmaxps_avx(auVar207,auVar197);
          auVar198._0_4_ = auVar66._0_4_ + auVar64._0_4_;
          auVar198._4_4_ = auVar66._4_4_ + auVar64._4_4_;
          auVar198._8_4_ = auVar66._8_4_ + auVar64._8_4_;
          auVar198._12_4_ = auVar66._12_4_ + auVar64._12_4_;
          auVar208._8_8_ = 0x3f80000000000000;
          auVar208._0_8_ = 0x3f80000000000000;
          auVar66 = vsubps_avx(auVar208,auVar198);
          auVar64 = vsubps_avx(auVar208,auVar59);
          auVar59 = vsubps_avx(auVar138,auVar60);
          auVar60 = vsubps_avx(auVar68,auVar60);
          fVar204 = auVar59._0_4_;
          auVar234._0_4_ = fVar204 * auVar66._0_4_;
          fVar212 = auVar59._4_4_;
          auVar234._4_4_ = fVar212 * auVar66._4_4_;
          fVar215 = auVar59._8_4_;
          auVar234._8_4_ = fVar215 * auVar66._8_4_;
          fVar224 = auVar59._12_4_;
          auVar234._12_4_ = fVar224 * auVar66._12_4_;
          auVar67 = vbroadcastss_avx512vl(auVar43);
          auVar58 = vmulps_avx512vl(auVar67,auVar58);
          auVar56 = vmulps_avx512vl(auVar67,auVar56);
          auVar67 = vminps_avx512vl(auVar58,auVar56);
          auVar58 = vmaxps_avx(auVar56,auVar58);
          auVar174._0_4_ = fVar103 * auVar57._0_4_;
          auVar174._4_4_ = fVar103 * auVar57._4_4_;
          auVar174._8_4_ = fVar103 * auVar57._8_4_;
          auVar174._12_4_ = fVar103 * auVar57._12_4_;
          auVar162._0_4_ = fVar103 * auVar65._0_4_;
          auVar162._4_4_ = fVar103 * auVar65._4_4_;
          auVar162._8_4_ = fVar103 * auVar65._8_4_;
          auVar162._12_4_ = fVar103 * auVar65._12_4_;
          auVar56 = vminps_avx(auVar174,auVar162);
          auVar57 = vaddps_avx512vl(auVar67,auVar56);
          auVar65 = vmulps_avx512vl(auVar59,auVar64);
          fVar188 = auVar60._0_4_;
          auVar199._0_4_ = fVar188 * auVar66._0_4_;
          fVar201 = auVar60._4_4_;
          auVar199._4_4_ = fVar201 * auVar66._4_4_;
          fVar202 = auVar60._8_4_;
          auVar199._8_4_ = fVar202 * auVar66._8_4_;
          fVar203 = auVar60._12_4_;
          auVar199._12_4_ = fVar203 * auVar66._12_4_;
          auVar209._0_4_ = fVar188 * auVar64._0_4_;
          auVar209._4_4_ = fVar201 * auVar64._4_4_;
          auVar209._8_4_ = fVar202 * auVar64._8_4_;
          auVar209._12_4_ = fVar203 * auVar64._12_4_;
          auVar56 = vmaxps_avx(auVar162,auVar174);
          auVar163._0_4_ = auVar58._0_4_ + auVar56._0_4_;
          auVar163._4_4_ = auVar58._4_4_ + auVar56._4_4_;
          auVar163._8_4_ = auVar58._8_4_ + auVar56._8_4_;
          auVar163._12_4_ = auVar58._12_4_ + auVar56._12_4_;
          auVar175._8_8_ = 0x3f800000;
          auVar175._0_8_ = 0x3f800000;
          auVar58 = vsubps_avx(auVar175,auVar163);
          auVar56 = vsubps_avx(auVar175,auVar57);
          auVar229._0_4_ = fVar204 * auVar58._0_4_;
          auVar229._4_4_ = fVar212 * auVar58._4_4_;
          auVar229._8_4_ = fVar215 * auVar58._8_4_;
          auVar229._12_4_ = fVar224 * auVar58._12_4_;
          auVar222._0_4_ = fVar204 * auVar56._0_4_;
          auVar222._4_4_ = fVar212 * auVar56._4_4_;
          auVar222._8_4_ = fVar215 * auVar56._8_4_;
          auVar222._12_4_ = fVar224 * auVar56._12_4_;
          auVar164._0_4_ = fVar188 * auVar58._0_4_;
          auVar164._4_4_ = fVar201 * auVar58._4_4_;
          auVar164._8_4_ = fVar202 * auVar58._8_4_;
          auVar164._12_4_ = fVar203 * auVar58._12_4_;
          auVar176._0_4_ = fVar188 * auVar56._0_4_;
          auVar176._4_4_ = fVar201 * auVar56._4_4_;
          auVar176._8_4_ = fVar202 * auVar56._8_4_;
          auVar176._12_4_ = fVar203 * auVar56._12_4_;
          auVar58 = vminps_avx(auVar229,auVar222);
          auVar56 = vminps_avx(auVar164,auVar176);
          auVar57 = vminps_avx(auVar58,auVar56);
          auVar58 = vmaxps_avx(auVar222,auVar229);
          auVar56 = vmaxps_avx(auVar176,auVar164);
          auVar56 = vmaxps_avx(auVar56,auVar58);
          auVar66 = vminps_avx512vl(auVar234,auVar65);
          auVar58 = vminps_avx(auVar199,auVar209);
          auVar58 = vminps_avx(auVar66,auVar58);
          auVar58 = vhaddps_avx(auVar57,auVar58);
          auVar65 = vmaxps_avx512vl(auVar65,auVar234);
          auVar57 = vmaxps_avx(auVar209,auVar199);
          auVar57 = vmaxps_avx(auVar57,auVar65);
          auVar56 = vhaddps_avx(auVar56,auVar57);
          auVar58 = vshufps_avx(auVar58,auVar58,0xe8);
          auVar56 = vshufps_avx(auVar56,auVar56,0xe8);
          auVar165._0_4_ = auVar58._0_4_ + auVar61._0_4_;
          auVar165._4_4_ = auVar58._4_4_ + auVar61._4_4_;
          auVar165._8_4_ = auVar58._8_4_ + auVar61._8_4_;
          auVar165._12_4_ = auVar58._12_4_ + auVar61._12_4_;
          auVar177._0_4_ = auVar56._0_4_ + auVar61._0_4_;
          auVar177._4_4_ = auVar56._4_4_ + auVar61._4_4_;
          auVar177._8_4_ = auVar56._8_4_ + auVar61._8_4_;
          auVar177._12_4_ = auVar56._12_4_ + auVar61._12_4_;
          auVar58 = vmaxps_avx(auVar138,auVar165);
          auVar56 = vminps_avx(auVar177,auVar68);
          uVar40 = vcmpps_avx512vl(auVar56,auVar58,1);
          local_368 = vinsertps_avx(auVar62,auVar63,0x10);
          auVar237 = ZEXT1664(local_368);
          auVar58 = ZEXT416(5);
          if ((uVar40 & 3) == 0) {
            vucomiss_avx512f(auVar42);
            auVar58 = vxorps_avx512vl(auVar58,auVar58);
            auVar246 = ZEXT1664(auVar58);
            if ((uint)uVar30 < 4 && (uVar6 == 0 || lVar33 == 0)) {
              bVar15 = false;
            }
            else {
              lVar33 = 200;
              do {
                auVar56 = vsubss_avx512f(auVar49,auVar61);
                fVar202 = auVar56._0_4_;
                fVar188 = fVar202 * fVar202 * fVar202;
                fVar203 = auVar61._0_4_;
                fVar201 = fVar203 * 3.0 * fVar202 * fVar202;
                fVar202 = fVar202 * fVar203 * fVar203 * 3.0;
                auVar151._4_4_ = fVar188;
                auVar151._0_4_ = fVar188;
                auVar151._8_4_ = fVar188;
                auVar151._12_4_ = fVar188;
                auVar141._4_4_ = fVar201;
                auVar141._0_4_ = fVar201;
                auVar141._8_4_ = fVar201;
                auVar141._12_4_ = fVar201;
                auVar113._4_4_ = fVar202;
                auVar113._0_4_ = fVar202;
                auVar113._8_4_ = fVar202;
                auVar113._12_4_ = fVar202;
                fVar203 = fVar203 * fVar203 * fVar203;
                auVar154._0_4_ = (float)local_348._0_4_ * fVar203;
                auVar154._4_4_ = (float)local_348._4_4_ * fVar203;
                auVar154._8_4_ = fStack_340 * fVar203;
                auVar154._12_4_ = fStack_33c * fVar203;
                auVar56 = vfmadd231ps_fma(auVar154,auVar47,auVar113);
                auVar56 = vfmadd231ps_fma(auVar56,auVar51,auVar141);
                auVar56 = vfmadd231ps_fma(auVar56,auVar4,auVar151);
                auVar114._8_8_ = auVar56._0_8_;
                auVar114._0_8_ = auVar56._0_8_;
                auVar56 = vshufpd_avx(auVar56,auVar56,3);
                auVar68 = vshufps_avx(auVar61,auVar61,0x55);
                auVar56 = vsubps_avx(auVar56,auVar114);
                auVar68 = vfmadd213ps_fma(auVar56,auVar68,auVar114);
                fVar188 = auVar68._0_4_;
                auVar56 = vshufps_avx(auVar68,auVar68,0x55);
                auVar115._0_4_ = auVar43._0_4_ * fVar188 + fVar103 * auVar56._0_4_;
                auVar115._4_4_ = auVar43._4_4_ * fVar188 + auVar54._4_4_ * auVar56._4_4_;
                auVar115._8_4_ = auVar43._8_4_ * fVar188 + auVar54._8_4_ * auVar56._8_4_;
                auVar115._12_4_ = auVar43._12_4_ * fVar188 + auVar54._12_4_ * auVar56._12_4_;
                auVar61 = vsubps_avx(auVar61,auVar115);
                auVar56 = vandps_avx512vl(auVar68,auVar240._0_16_);
                auVar68 = vprolq_avx512vl(auVar56,0x20);
                auVar56 = vmaxss_avx(auVar68,auVar56);
                bVar39 = auVar56._0_4_ <= (float)local_358._0_4_;
                if (auVar56._0_4_ < (float)local_358._0_4_) {
                  auVar43 = vucomiss_avx512f(auVar58);
                  if (bVar39) {
                    auVar49 = vucomiss_avx512f(auVar43);
                    auVar242 = ZEXT1664(auVar49);
                    if (bVar39) {
                      vmovshdup_avx(auVar43);
                      auVar49 = vucomiss_avx512f(auVar58);
                      if (bVar39) {
                        auVar54 = vucomiss_avx512f(auVar49);
                        auVar242 = ZEXT1664(auVar54);
                        if (bVar39) {
                          auVar56 = vinsertps_avx(ZEXT416((uint)(pLVar36->vx).field_0.m128[2]),
                                                  ZEXT416(*(uint *)((long)&(pLVar36->vy).field_0 + 8
                                                                   )),0x1c);
                          auVar60 = vinsertps_avx(auVar56,ZEXT416(*(uint *)((long)&(pLVar36->vz).
                                                                                   field_0 + 8)),
                                                  0x28);
                          auVar56 = vdpps_avx(auVar60,local_178,0x7f);
                          auVar68 = vdpps_avx(auVar60,local_188,0x7f);
                          auVar57 = vdpps_avx(auVar60,local_198,0x7f);
                          auVar65 = vdpps_avx(auVar60,local_1a8,0x7f);
                          auVar66 = vdpps_avx(auVar60,local_1b8,0x7f);
                          auVar64 = vdpps_avx(auVar60,local_1c8,0x7f);
                          auVar59 = vdpps_avx(auVar60,local_1d8,0x7f);
                          auVar60 = vdpps_avx(auVar60,local_1e8,0x7f);
                          auVar61 = vsubss_avx512f(auVar54,auVar49);
                          fVar103 = auVar49._0_4_;
                          auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar103 * auVar66._0_4_)),auVar61
                                                    ,auVar56);
                          auVar56 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * fVar103)),auVar61
                                                    ,auVar68);
                          auVar68 = vfmadd231ss_fma(ZEXT416((uint)(auVar59._0_4_ * fVar103)),auVar61
                                                    ,auVar57);
                          auVar57 = vfmadd231ss_fma(ZEXT416((uint)(fVar103 * auVar60._0_4_)),auVar61
                                                    ,auVar65);
                          auVar54 = vsubss_avx512f(auVar54,auVar43);
                          auVar166._0_4_ = auVar54._0_4_;
                          fVar103 = auVar166._0_4_ * auVar166._0_4_ * auVar166._0_4_;
                          local_118 = auVar43._0_4_;
                          fVar188 = local_118 * 3.0 * auVar166._0_4_ * auVar166._0_4_;
                          fVar201 = auVar166._0_4_ * local_118 * local_118 * 3.0;
                          fVar203 = local_118 * local_118 * local_118;
                          auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * auVar57._0_4_)),
                                                    ZEXT416((uint)fVar201),auVar68);
                          auVar54 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar188),auVar56);
                          auVar49 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar103),auVar49);
                          fVar202 = auVar49._0_4_;
                          if ((fVar1 <= fVar202) &&
                             (fVar204 = *(float *)(ray + k * 4 + 0x80), fVar202 <= fVar204)) {
                            local_108 = vshufps_avx(auVar43,auVar43,0x55);
                            auVar54 = vsubps_avx512vl(auVar50,local_108);
                            fVar212 = local_108._0_4_;
                            auVar184._0_4_ = fVar212 * (float)local_208._0_4_;
                            fVar215 = local_108._4_4_;
                            auVar184._4_4_ = fVar215 * (float)local_208._4_4_;
                            fVar224 = local_108._8_4_;
                            auVar184._8_4_ = fVar224 * fStack_200;
                            fVar225 = local_108._12_4_;
                            auVar184._12_4_ = fVar225 * fStack_1fc;
                            auVar200._0_4_ = fVar212 * (float)local_258._0_4_;
                            auVar200._4_4_ = fVar215 * (float)local_258._4_4_;
                            auVar200._8_4_ = fVar224 * fStack_250;
                            auVar200._12_4_ = fVar225 * fStack_24c;
                            auVar210._0_4_ = fVar212 * (float)local_268._0_4_;
                            auVar210._4_4_ = fVar215 * (float)local_268._4_4_;
                            auVar210._8_4_ = fVar224 * fStack_260;
                            auVar210._12_4_ = fVar225 * fStack_25c;
                            auVar223._0_4_ = fVar212 * (float)local_228._0_4_;
                            auVar223._4_4_ = fVar215 * (float)local_228._4_4_;
                            auVar223._8_4_ = fVar224 * fStack_220;
                            auVar223._12_4_ = fVar225 * fStack_21c;
                            auVar50 = vfmadd231ps_fma(auVar184,auVar54,local_1f8);
                            auVar43 = vfmadd231ps_fma(auVar200,auVar54,local_238);
                            auVar49 = vfmadd231ps_fma(auVar210,auVar54,local_248);
                            auVar54 = vfmadd231ps_fma(auVar223,auVar54,local_218);
                            auVar50 = vsubps_avx(auVar43,auVar50);
                            auVar43 = vsubps_avx(auVar49,auVar43);
                            auVar49 = vsubps_avx(auVar54,auVar49);
                            auVar211._0_4_ = auVar43._0_4_ * local_118;
                            auVar211._4_4_ = auVar43._4_4_ * local_118;
                            auVar211._8_4_ = auVar43._8_4_ * local_118;
                            auVar211._12_4_ = auVar43._12_4_ * local_118;
                            auVar166._4_4_ = auVar166._0_4_;
                            auVar166._8_4_ = auVar166._0_4_;
                            auVar166._12_4_ = auVar166._0_4_;
                            auVar50 = vfmadd231ps_fma(auVar211,auVar166,auVar50);
                            auVar178._0_4_ = auVar49._0_4_ * local_118;
                            auVar178._4_4_ = auVar49._4_4_ * local_118;
                            auVar178._8_4_ = auVar49._8_4_ * local_118;
                            auVar178._12_4_ = auVar49._12_4_ * local_118;
                            auVar43 = vfmadd231ps_fma(auVar178,auVar166,auVar43);
                            auVar179._0_4_ = auVar43._0_4_ * local_118;
                            auVar179._4_4_ = auVar43._4_4_ * local_118;
                            auVar179._8_4_ = auVar43._8_4_ * local_118;
                            auVar179._12_4_ = auVar43._12_4_ * local_118;
                            auVar50 = vfmadd231ps_fma(auVar179,auVar166,auVar50);
                            auVar50 = vmulps_avx512vl(auVar50,auVar144);
                            pGVar7 = (context->scene->geometries).items[uVar37].ptr;
                            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                              bVar39 = false;
                            }
                            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                    (bVar39 = true,
                                    pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar155._0_4_ = fVar203 * (float)local_2b8._0_4_;
                              auVar155._4_4_ = fVar203 * (float)local_2b8._4_4_;
                              auVar155._8_4_ = fVar203 * fStack_2b0;
                              auVar155._12_4_ = fVar203 * fStack_2ac;
                              auVar152._4_4_ = fVar201;
                              auVar152._0_4_ = fVar201;
                              auVar152._8_4_ = fVar201;
                              auVar152._12_4_ = fVar201;
                              auVar43 = vfmadd132ps_fma(auVar152,auVar155,local_2a8);
                              auVar134._4_4_ = fVar188;
                              auVar134._0_4_ = fVar188;
                              auVar134._8_4_ = fVar188;
                              auVar134._12_4_ = fVar188;
                              auVar43 = vfmadd132ps_fma(auVar134,auVar43,local_298);
                              auVar121._4_4_ = fVar103;
                              auVar121._0_4_ = fVar103;
                              auVar121._8_4_ = fVar103;
                              auVar121._12_4_ = fVar103;
                              auVar54 = vfmadd132ps_fma(auVar121,auVar43,local_288);
                              auVar43 = vshufps_avx(auVar54,auVar54,0xc9);
                              auVar49 = vshufps_avx(auVar50,auVar50,0xc9);
                              auVar122._0_4_ = auVar54._0_4_ * auVar49._0_4_;
                              auVar122._4_4_ = auVar54._4_4_ * auVar49._4_4_;
                              auVar122._8_4_ = auVar54._8_4_ * auVar49._8_4_;
                              auVar122._12_4_ = auVar54._12_4_ * auVar49._12_4_;
                              auVar43 = vfmsub231ps_fma(auVar122,auVar50,auVar43);
                              auVar50 = vshufps_avx(auVar43,auVar43,0x55);
                              local_138 = vshufps_avx(auVar43,auVar43,0xaa);
                              local_128 = auVar43._0_4_;
                              local_148[0] = (RTCHitN)auVar50[0];
                              local_148[1] = (RTCHitN)auVar50[1];
                              local_148[2] = (RTCHitN)auVar50[2];
                              local_148[3] = (RTCHitN)auVar50[3];
                              local_148[4] = (RTCHitN)auVar50[4];
                              local_148[5] = (RTCHitN)auVar50[5];
                              local_148[6] = (RTCHitN)auVar50[6];
                              local_148[7] = (RTCHitN)auVar50[7];
                              local_148[8] = (RTCHitN)auVar50[8];
                              local_148[9] = (RTCHitN)auVar50[9];
                              local_148[10] = (RTCHitN)auVar50[10];
                              local_148[0xb] = (RTCHitN)auVar50[0xb];
                              local_148[0xc] = (RTCHitN)auVar50[0xc];
                              local_148[0xd] = (RTCHitN)auVar50[0xd];
                              local_148[0xe] = (RTCHitN)auVar50[0xe];
                              local_148[0xf] = (RTCHitN)auVar50[0xf];
                              uStack_124 = local_128;
                              uStack_120 = local_128;
                              uStack_11c = local_128;
                              fStack_114 = local_118;
                              fStack_110 = local_118;
                              fStack_10c = local_118;
                              local_f8 = local_278._0_8_;
                              uStack_f0 = local_278._8_8_;
                              local_e8 = local_2c8;
                              vpcmpeqd_avx2(ZEXT1632(local_2c8),ZEXT1632(local_2c8));
                              uStack_d4 = context->user->instID[0];
                              local_d8 = uStack_d4;
                              uStack_d0 = uStack_d4;
                              uStack_cc = uStack_d4;
                              uStack_c8 = context->user->instPrimID[0];
                              uStack_c4 = uStack_c8;
                              uStack_c0 = uStack_c8;
                              uStack_bc = uStack_c8;
                              *(float *)(ray + k * 4 + 0x80) = fVar202;
                              local_388 = local_2d8._0_8_;
                              uStack_380 = local_2d8._8_8_;
                              local_308.valid = (int *)&local_388;
                              local_308.geometryUserPtr = pGVar7->userPtr;
                              local_308.context = context->user;
                              local_308.ray = (RTCRayN *)ray;
                              local_308.hit = local_148;
                              local_308.N = 4;
                              if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                local_378 = ray;
                                (*pGVar7->occlusionFilterN)(&local_308);
                                auVar237 = ZEXT1664(local_368);
                                auVar50 = vxorps_avx512vl(auVar58,auVar58);
                                auVar246 = ZEXT1664(auVar50);
                                auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar243 = ZEXT1664(auVar50);
                                auVar242 = ZEXT464(0x3f800000);
                                auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar239 = ZEXT3264(auVar75);
                                auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar241 = ZEXT1664(auVar50);
                                auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar240 = ZEXT1664(auVar50);
                                auVar50 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar238 = ZEXT1664(auVar50);
                                auVar75 = vbroadcastss_avx512vl(ZEXT416(2));
                                auVar244 = ZEXT3264(auVar75);
                                ray = local_378;
                              }
                              auVar50 = auVar246._0_16_;
                              auVar26._8_8_ = uStack_380;
                              auVar26._0_8_ = local_388;
                              uVar40 = vptestmd_avx512vl(auVar26,auVar26);
                              if ((uVar40 & 0xf) == 0) {
                                bVar39 = false;
                              }
                              else {
                                p_Var10 = context->args->filter;
                                if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var10)(&local_308);
                                  auVar237 = ZEXT1664(local_368);
                                  auVar50 = vxorps_avx512vl(auVar50,auVar50);
                                  auVar246 = ZEXT1664(auVar50);
                                  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar243 = ZEXT1664(auVar50);
                                  auVar242 = ZEXT464(0x3f800000);
                                  auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar239 = ZEXT3264(auVar75);
                                  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar241 = ZEXT1664(auVar50);
                                  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar240 = ZEXT1664(auVar50);
                                  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar238 = ZEXT1664(auVar50);
                                  auVar75 = vbroadcastss_avx512vl(ZEXT416(2));
                                  auVar244 = ZEXT3264(auVar75);
                                }
                                auVar27._8_8_ = uStack_380;
                                auVar27._0_8_ = local_388;
                                uVar40 = vptestmd_avx512vl(auVar27,auVar27);
                                uVar40 = uVar40 & 0xf;
                                auVar50 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                bVar39 = (bool)((byte)uVar40 & 1);
                                bVar11 = (bool)((byte)(uVar40 >> 1) & 1);
                                bVar12 = (bool)((byte)(uVar40 >> 2) & 1);
                                bVar13 = SUB81(uVar40 >> 3,0);
                                *(uint *)(local_308.ray + 0x80) =
                                     (uint)bVar39 * auVar50._0_4_ |
                                     (uint)!bVar39 * *(int *)(local_308.ray + 0x80);
                                *(uint *)(local_308.ray + 0x84) =
                                     (uint)bVar11 * auVar50._4_4_ |
                                     (uint)!bVar11 * *(int *)(local_308.ray + 0x84);
                                *(uint *)(local_308.ray + 0x88) =
                                     (uint)bVar12 * auVar50._8_4_ |
                                     (uint)!bVar12 * *(int *)(local_308.ray + 0x88);
                                *(uint *)(local_308.ray + 0x8c) =
                                     (uint)bVar13 * auVar50._12_4_ |
                                     (uint)!bVar13 * *(int *)(local_308.ray + 0x8c);
                                bVar39 = (byte)uVar40 != 0;
                              }
                              if (!bVar39) {
                                *(float *)(ray + k * 4 + 0x80) = fVar204;
                              }
                            }
                            bVar38 = (bool)(bVar38 | bVar39);
                            pLVar36 = local_370;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar33 = lVar33 + -1;
              } while (lVar33 != 0);
            }
          }
          else {
            auVar50 = vxorps_avx512vl(ZEXT416(5),auVar58);
            auVar246 = ZEXT1664(auVar50);
          }
        }
        else {
          auVar237 = ZEXT1664(auVar235);
        }
      }
    } while (bVar15);
    auVar50 = vinsertps_avx512f(auVar42,auVar55,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }